

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O3

NodeRecordMB4D * __thiscall
embree::sse2::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::TriangleMesh,_embree::TriangleMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(NodeRecordMB4D *__return_storage_ptr__,
                 BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::TriangleMesh,_embree::TriangleMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,BuildRecord *in,CachedAllocator alloc)

{
  size_t *psVar1;
  atomic<unsigned_long> *paVar2;
  pointer *pppTVar3;
  Split *pSVar4;
  pointer pcVar5;
  PrimRefVector pmVar6;
  _Alloc_hider begin;
  Device *pDVar7;
  FastAllocator *pFVar8;
  ThreadLocal2 *pTVar9;
  iterator iVar10;
  _func_int **pp_Var11;
  PrimRefMB *pPVar12;
  Scene *pSVar13;
  Geometry *pGVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  undefined8 uVar18;
  bool bVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aVar21;
  vint *pvVar22;
  unsigned_long uVar23;
  unsigned_long uVar24;
  BBox1f BVar25;
  undefined4 uVar26;
  char cVar27;
  int iVar28;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *this_00;
  Device *pDVar29;
  pointer pcVar30;
  void *pvVar31;
  undefined8 *puVar32;
  runtime_error *prVar33;
  long lVar34;
  undefined8 uVar35;
  size_t sVar36;
  float *pfVar37;
  _Alloc_hider *p_Var38;
  Split *pSVar39;
  PrimRefMB *pPVar40;
  char *pcVar41;
  ulong uVar42;
  BuildRecord *in_00;
  ulong uVar43;
  long lVar44;
  uint uVar45;
  undefined8 uVar46;
  ulong uVar47;
  ulong uVar48;
  long lVar49;
  long *plVar50;
  long lVar51;
  long lVar52;
  mvector<PrimRefMB> *prims;
  Split *pSVar53;
  code *pcVar54;
  BBox1f *pBVar55;
  long lVar56;
  ulong uVar57;
  Device *pDVar58;
  size_t i;
  bool bVar59;
  undefined1 auVar60 [16];
  size_type sVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar64;
  float fVar65;
  float fVar67;
  float fVar68;
  undefined1 auVar66 [16];
  float fVar69;
  float fVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar81;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar89;
  float fVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::TriangleMesh,_embree::TriangleMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
  *this_01;
  undefined1 local_1e80 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1e60;
  _Alloc_hider local_1e50;
  undefined1 local_1e48 [16];
  undefined1 local_1e38 [16];
  undefined1 local_1e28 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1e20;
  _Alloc_hider local_1e10;
  undefined1 (*local_1e08) [16];
  float local_1e00 [2];
  BBox1f time_range1;
  BBox1f time_range0;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1dd8;
  PrimRefVector lprims;
  undefined1 local_1db8 [32];
  PrimInfoMB left;
  PrimInfoMB right;
  vuint<4> v2;
  undefined1 local_1c68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c58;
  undefined1 local_1c48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c38;
  undefined1 local_1c28 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c18;
  _Alloc_hider local_1c08;
  undefined1 auStack_1c00 [24];
  BBox1f local_1be8;
  float fStack_1be0;
  float fStack_1bdc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1bd8;
  _Alloc_hider local_1bc8;
  undefined1 auStack_1bc0 [24];
  _Alloc_hider local_1ba8;
  undefined1 auStack_1ba0 [32];
  anon_class_1_0_00000001 reduction;
  undefined1 local_1b68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b58;
  vuint<4> geomID;
  undefined1 local_1b38 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1b28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1b08;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1af8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ae8;
  undefined1 local_1ad8 [16];
  undefined1 local_1ac8 [8];
  _Alloc_hider _Stack_1ac0;
  undefined1 local_1ab8 [32];
  undefined1 local_1a98 [32];
  undefined1 local_1a78 [24];
  _Alloc_hider _Stack_1a60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a58;
  vbool vSplitMask;
  anon_class_1_0_00000001 reduction2;
  undefined1 local_19e8 [16];
  anon_class_24_3_c5d13451 isLeft;
  vint vSplitPos;
  BuildRecordSplit current;
  undefined1 local_17d8 [16];
  vuint<4> v0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_17b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_17a8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1798;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1788;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1778;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1768;
  _Alloc_hider local_1758;
  pointer pcStack_1750;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1748;
  BBox1f local_1738;
  float fStack_1730;
  float fStack_172c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1728;
  undefined1 local_1718 [32];
  _Alloc_hider local_16f8;
  size_type sStack_16f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_16e8 [226];
  FastAllocator *local_8c8 [16];
  Device *local_848;
  undefined1 local_840 [520];
  NodeRecordMB4D values [16];
  
  uVar42 = in->depth;
  local_1e10._M_p = (pointer)__return_storage_ptr__;
  if ((this->cfg).maxDepth < uVar42) {
    puVar32 = (undefined8 *)__cxa_allocate_exception(0x30);
    v0.field_0.v[0] = (longlong)&local_17b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&v0,"depth limit reached","");
    *puVar32 = &PTR__rtcore_error_02184a18;
    *(undefined4 *)(puVar32 + 1) = 1;
    puVar32[2] = puVar32 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar32 + 2),v0.field_0.v[0],v0.field_0.v[1] + v0.field_0.v[0]);
    __cxa_throw(puVar32,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  local_1e38 = *(undefined1 (*) [16])
                &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                 geomBounds.bounds0.lower.field_0;
  aVar20 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds0.upper.field_0.m128;
  local_1e80._8_16_ =
       *(undefined1 (*) [16])
        (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
        bounds1.lower.field_0.m128;
  local_1e80._24_8_ =
       *(undefined8 *)
        &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
         bounds1.upper.field_0;
  aStack_1e60._M_allocated_capacity =
       *(size_type *)
        ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                geomBounds.bounds1.upper.field_0 + 8);
  _local_1e28 = *(undefined1 (*) [16])
                 (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                 centBounds.lower.field_0.m128;
  aVar21 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               centBounds.upper.field_0.m128;
  pcVar30 = (pointer)(in->prims).super_PrimInfoMB.object_range._begin;
  pcVar5 = (pointer)(in->prims).super_PrimInfoMB.object_range._end;
  values[0].lbounds.bounds0.lower.field_0._0_8_ = (in->prims).super_PrimInfoMB.max_time_range;
  values[0].lbounds.bounds0.lower.field_0._8_8_ = (in->prims).super_PrimInfoMB.time_range;
  values[0].ref.ptr = (in->prims).super_PrimInfoMB.num_time_segments;
  values[0]._8_8_ = (in->prims).super_PrimInfoMB.max_num_time_segments;
  pmVar6 = (in->prims).prims;
  uVar46 = &v0;
  findFallback((Split *)uVar46,this,&in->prims);
  local_1718._16_8_ = local_17b8._0_8_;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds0.lower.field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)local_1e38;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds1.lower.field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)local_1e80._8_16_;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds1.upper.field_0._0_8_ = local_1e80._24_8_;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds1.upper.field_0._8_8_ = aStack_1e60._M_allocated_capacity;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  centBounds.lower.field_0.m128[0] = (float)local_1e28._0_4_;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  centBounds.lower.field_0.m128[1] = (float)local_1e28._4_4_;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  centBounds.lower.field_0.m128[2] = (float)aStack_1e20._M_allocated_capacity._0_4_;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  centBounds.lower.field_0.m128[3] = (float)aStack_1e20._M_allocated_capacity._4_4_;
  current.super_BuildRecord.prims.super_PrimInfoMB.num_time_segments = values[0].ref.ptr;
  current.super_BuildRecord.prims.super_PrimInfoMB.max_num_time_segments = values[0]._8_8_;
  current.super_BuildRecord.prims.super_PrimInfoMB.max_time_range.lower =
       (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
  current.super_BuildRecord.prims.super_PrimInfoMB.max_time_range.upper =
       (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
  current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower =
       (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper =
       (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
  BVar25 = current.super_BuildRecord.prims.super_PrimInfoMB.time_range;
  current.split.sah = (float)v0.field_0._0_4_;
  current.split.dim = v0.field_0._4_4_;
  current.split.field_2 = (anon_union_4_2_620955e9_for_BinSplit<32UL>_3)v0.field_0._8_4_;
  current.split.data = v0.field_0._12_4_;
  uVar35 = current.split._8_8_;
  current.split.mapping.num = local_17b8._0_8_;
  current.split.mapping.ofs.field_0._0_8_ = local_17a8._M_allocated_capacity;
  current.split.mapping.ofs.field_0._8_8_ = local_17a8._8_8_;
  local_16e8[0]._0_8_ = local_1798._0_8_;
  local_16e8[0]._8_8_ = local_1798._8_8_;
  current.split.mapping.scale.field_0._0_8_ = local_1798._0_8_;
  current.split.mapping.scale.field_0._8_8_ = local_1798._8_8_;
  uVar57 = (long)pcVar5 - (long)pcVar30;
  if (uVar57 == 0 || uVar42 != 1) {
    bVar19 = false;
  }
  else {
    current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower =
         (float)values[0].lbounds.bounds0.lower.field_0._8_8_;
    current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper =
         (float)((ulong)values[0].lbounds.bounds0.lower.field_0._8_8_ >> 0x20);
    lVar34 = (long)pcVar5 - (long)pcVar30;
    if (pcVar5 < pcVar30 || lVar34 == 0) {
      auVar73._0_12_ = ZEXT812(0x7f800000);
      auVar73._12_4_ = 0;
      fVar90 = -INFINITY;
    }
    else {
      pfVar37 = &pmVar6->items[(long)pcVar30].time_range.upper;
      auVar73._0_12_ = ZEXT812(0x7f800000);
      auVar73._12_4_ = 0;
      fVar84 = -INFINITY;
      do {
        if (((BBox1f *)(pfVar37 + -1))->lower <= auVar73._0_4_) {
          auVar73._0_4_ = ((BBox1f *)(pfVar37 + -1))->lower;
        }
        fVar90 = *pfVar37;
        if (*pfVar37 <= fVar84) {
          fVar90 = fVar84;
        }
        pfVar37 = pfVar37 + 0x14;
        lVar34 = lVar34 + -1;
        fVar84 = fVar90;
      } while (lVar34 != 0);
    }
    bVar19 = fVar90 < current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper ||
             current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower < auVar73._0_4_;
  }
  current.super_BuildRecord.depth = uVar42;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds0.upper.field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)aVar20;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  centBounds.upper.field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)aVar21;
  current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin = (unsigned_long)pcVar30;
  current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end = (unsigned_long)pcVar5;
  current.super_BuildRecord.prims.super_PrimInfoMB.time_range = BVar25;
  current.super_BuildRecord.prims.prims = pmVar6;
  current.split._8_8_ = uVar35;
  if (((uVar57 <= (this->cfg).maxLeafSize) &&
      (current.split.data = (uint)((ulong)v0.field_0._8_8_ >> 0x20), current.split.data < 2)) &&
     (!bVar19)) {
    uVar42 = uVar57 + 3 >> 2;
    geomID.field_0.v[0] = uVar42 * 0x50;
    pTVar9 = (alloc.talloc1)->parent;
    if (alloc.alloc != (pTVar9->alloc)._M_b._M_p) {
      values[0]._8_1_ = 1;
      values[0].ref.ptr = (size_t)pTVar9;
      MutexSys::lock(&pTVar9->mutex);
      if ((pTVar9->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar2 = &((pTVar9->alloc)._M_b._M_p)->bytesUsed;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar9->alloc1).bytesUsed + (pTVar9->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar9->alloc)._M_b._M_p)->bytesFree;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar9->alloc0).end + (pTVar9->alloc1).end) -
             ((pTVar9->alloc0).cur + (pTVar9->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar9->alloc)._M_b._M_p)->bytesWasted;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar9->alloc1).bytesWasted + (pTVar9->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar9->alloc0).bytesUsed = 0;
      (pTVar9->alloc0).bytesWasted = 0;
      (pTVar9->alloc0).end = 0;
      (pTVar9->alloc0).allocBlockSize = 0;
      (pTVar9->alloc0).ptr = (char *)0x0;
      (pTVar9->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar9->alloc1).bytesUsed = 0;
        (pTVar9->alloc1).bytesWasted = 0;
        (pTVar9->alloc1).end = 0;
        (pTVar9->alloc1).allocBlockSize = 0;
        (pTVar9->alloc1).ptr = (char *)0x0;
        (pTVar9->alloc1).cur = 0;
      }
      else {
        (pTVar9->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar9->alloc1).ptr = (char *)0x0;
        (pTVar9->alloc1).cur = 0;
        (pTVar9->alloc1).end = 0;
        (pTVar9->alloc1).allocBlockSize = 0;
        (pTVar9->alloc1).bytesUsed = 0;
        (pTVar9->alloc1).bytesWasted = 0;
        (pTVar9->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar9->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      v0.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
      v0.field_0.v[1]._0_1_ = 1;
      v2.field_0.v[0] = (longlong)pTVar9;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar10._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar10._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar10,(ThreadLocal2 **)&v2);
      }
      else {
        *iVar10._M_current = (ThreadLocal2 *)v2.field_0.v[0];
        pppTVar3 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar3 = *pppTVar3 + 1;
      }
      MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      if (values[0]._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)values[0].ref.ptr);
      }
    }
    uVar46 = geomID.field_0.v[0];
    (alloc.talloc1)->bytesUsed = (alloc.talloc1)->bytesUsed + geomID.field_0.v[0];
    sVar36 = (alloc.talloc1)->cur;
    uVar48 = (ulong)(-(int)sVar36 & 0xf);
    uVar43 = sVar36 + geomID.field_0.v[0] + uVar48;
    (alloc.talloc1)->cur = uVar43;
    if ((alloc.talloc1)->end < uVar43) {
      (alloc.talloc1)->cur = sVar36;
      uVar48 = (alloc.talloc1)->allocBlockSize;
      if ((ulong)(geomID.field_0.v[0] * 4) < uVar48 || geomID.field_0.v[0] * 4 - uVar48 == 0) {
        v0.field_0.v[0] = uVar48;
        pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
        (alloc.talloc1)->ptr = pcVar41;
        sVar36 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar36;
        (alloc.talloc1)->end = v0.field_0.v[0];
        (alloc.talloc1)->cur = uVar46;
        if ((ulong)v0.field_0.v[0] < (ulong)uVar46) {
          (alloc.talloc1)->cur = 0;
          v0.field_0.v[0] = (alloc.talloc1)->allocBlockSize;
          pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
          (alloc.talloc1)->ptr = pcVar41;
          sVar36 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
          (alloc.talloc1)->bytesWasted = sVar36;
          (alloc.talloc1)->end = v0.field_0.v[0];
          (alloc.talloc1)->cur = uVar46;
          if ((ulong)v0.field_0.v[0] < (ulong)uVar46) {
            (alloc.talloc1)->cur = 0;
            pcVar41 = (char *)0x0;
            goto LAB_00c41f89;
          }
        }
        (alloc.talloc1)->bytesWasted = sVar36;
      }
      else {
        pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&geomID);
      }
    }
    else {
      (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar48;
      pcVar41 = (alloc.talloc1)->ptr + (uVar43 - geomID.field_0._0_8_);
    }
LAB_00c41f89:
    uVar48 = 7;
    if (uVar42 < 7) {
      uVar48 = uVar42;
    }
    local_17d8 = _DAT_01f7a9f0;
    if (uVar57 + 3 < 4) {
      local_1db8._8_8_ = 0xff800000ff800000;
      local_1db8._0_8_ = 0xff800000ff800000;
      local_1b68._8_8_ = 0xff800000ff800000;
      local_1b68._0_8_ = 0xff800000ff800000;
      local_1e48 = _DAT_01f7a9f0;
    }
    else {
      lVar34 = 0;
      local_1b68._8_8_ = 0xff800000ff800000;
      local_1b68._0_8_ = 0xff800000ff800000;
      local_1e48 = _DAT_01f7a9f0;
      local_1db8._8_8_ = 0xff800000ff800000;
      local_1db8._0_8_ = 0xff800000ff800000;
      do {
        BVar25 = current.super_BuildRecord.prims.super_PrimInfoMB.time_range;
        pPVar12 = (current.super_BuildRecord.prims.prims)->items;
        pSVar13 = ((this->createLeaf).bvh)->scene;
        v0.field_0.v[0] = 0;
        v0.field_0.v[1] = 0;
        values[0].ref.ptr = 0;
        values[0]._8_8_ = 0;
        v2.field_0.v[0] = 0;
        v2.field_0.v[1] = 0;
        geomID.field_0.v[0] = -1;
        geomID.field_0.v[1] = -1;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
             0xffffffffffffffff;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
             0xffffffffffffffff;
        pPVar40 = pPVar12 + (long)pcVar30;
        lVar44 = 0;
        do {
          if (pcVar30 < current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end) {
            fVar90 = (pPVar40->lbounds).bounds0.lower.field_0.m128[3];
            *(float *)((long)&geomID.field_0 + lVar44) = fVar90;
            fVar84 = (pPVar40->lbounds).bounds0.upper.field_0.m128[3];
            *(float *)((long)&left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0
                              .lower.field_0 + lVar44) = fVar84;
            pGVar14 = (pSVar13->geometries).items[(uint)fVar90].ptr;
            lVar15 = *(long *)&pGVar14->field_0x58;
            lVar49 = (ulong)(uint)fVar84 *
                     pGVar14[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
            uVar45 = *(uint *)&pGVar14[1].intersectionFilterN >> 2;
            *(uint *)((long)&v0.field_0 + lVar44) = *(int *)(lVar15 + lVar49) * uVar45;
            *(uint *)((long)&values[0].ref.ptr + lVar44) = *(int *)(lVar15 + 4 + lVar49) * uVar45;
            *(uint *)((long)&v2.field_0 + lVar44) = uVar45 * *(int *)(lVar15 + 8 + lVar49);
            pcVar30 = pcVar30 + 1;
          }
          else if (lVar44 != 0) {
            *(uint *)((long)&geomID.field_0 + lVar44) = geomID.field_0.i[0];
            *(undefined4 *)
             ((long)&left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0 + lVar44) = 0xffffffff;
            uVar26 = v0.field_0.i[0];
            *(uint *)((long)&v0.field_0 + lVar44) = v0.field_0.i[0];
            *(undefined4 *)((long)&values[0].ref.ptr + lVar44) = uVar26;
            *(undefined4 *)((long)&v2.field_0 + lVar44) = uVar26;
          }
          if (pcVar30 < current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end) {
            pPVar40 = pPVar12 + (long)pcVar30;
          }
          lVar44 = lVar44 + 4;
        } while (lVar44 != 0x10);
        lVar44 = lVar34 * 0x50;
        local_1e50._M_p = pcVar41 + lVar44;
        *(longlong *)(pcVar41 + lVar44) = v0.field_0.v[0];
        *(longlong *)((long)(pcVar41 + lVar44) + 8) = v0.field_0.v[1];
        *(size_t *)(pcVar41 + lVar44 + 0x10) = values[0].ref.ptr;
        *(undefined8 *)((long)(pcVar41 + lVar44 + 0x10) + 8) = values[0]._8_8_;
        *(longlong *)(pcVar41 + lVar44 + 0x20) = v2.field_0.v[0];
        *(longlong *)((long)(pcVar41 + lVar44 + 0x20) + 8) = v2.field_0.v[1];
        *(longlong *)(pcVar41 + lVar44 + 0x30) = geomID.field_0.v[0];
        *(longlong *)((long)(pcVar41 + lVar44 + 0x30) + 8) = geomID.field_0.v[1];
        *(undefined8 *)(pcVar41 + lVar44 + 0x40) =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        *(undefined8 *)(pcVar41 + lVar44 + 0x40 + 8) =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        local_1b58._M_allocated_capacity._4_4_ =
             current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
        lVar44 = 0;
        unique0x10008932 = _DAT_01f7a9f0;
        _local_1e28 = _DAT_01f7aa00;
        local_1e80._8_16_ = _DAT_01f7aa00;
        auVar73 = _DAT_01f7a9f0;
        do {
          uVar45 = *(uint *)(local_1e50._M_p + lVar44 * 4 + 0x40);
          if ((ulong)uVar45 == 0xffffffff) break;
          pGVar14 = (pSVar13->geometries).items[*(uint *)(local_1e50._M_p + lVar44 * 4 + 0x30)].ptr;
          fVar90 = pGVar14->fnumTimeSegments;
          fVar84 = (pGVar14->time_range).lower;
          local_1b58._M_allocated_capacity._0_4_ = BVar25.lower;
          fVar95 = (pGVar14->time_range).upper - fVar84;
          fVar89 = ((float)local_1b58._M_allocated_capacity._0_4_ - fVar84) / fVar95;
          fVar95 = ((float)local_1b58._M_allocated_capacity._4_4_ - fVar84) / fVar95;
          local_1e00[0] = fVar89;
          fVar89 = fVar90 * fVar89;
          local_1a58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        )ZEXT416((uint)fVar89);
          local_1e08 = (undefined1 (*) [16])CONCAT44(local_1e08._4_4_,fVar95);
          local_1e38._0_4_ = fVar90 * fVar95;
          fVar84 = floorf(fVar89);
          fVar89 = ceilf((float)local_1e38._0_4_);
          iVar28 = (int)fVar84;
          if (fVar84 <= 0.0) {
            fVar84 = 0.0;
          }
          fVar95 = fVar89;
          if (fVar90 <= fVar89) {
            fVar95 = fVar90;
          }
          if (iVar28 < 0) {
            iVar28 = -1;
          }
          uVar17 = (int)fVar90 + 1U;
          if ((int)fVar89 < (int)((int)fVar90 + 1U)) {
            uVar17 = (int)fVar89;
          }
          lVar15 = *(long *)&pGVar14->field_0x58;
          lVar56 = (ulong)uVar45 *
                   pGVar14[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          uVar57 = (ulong)*(uint *)(lVar15 + lVar56);
          uVar43 = (ulong)*(uint *)(lVar15 + 4 + lVar56);
          lVar49 = *(long *)&pGVar14[2].numPrimitives;
          lVar51 = (long)(int)fVar84 * 0x38;
          lVar16 = *(long *)(lVar49 + lVar51);
          lVar52 = *(long *)(lVar49 + 0x10 + lVar51);
          auVar88 = *(undefined1 (*) [16])(lVar16 + lVar52 * uVar57);
          auVar80 = *(undefined1 (*) [16])(lVar16 + lVar52 * uVar43);
          uVar47 = (ulong)*(uint *)(lVar15 + 8 + lVar56);
          auVar83 = *(undefined1 (*) [16])(lVar16 + lVar52 * uVar47);
          auVar86 = minps(auVar88,auVar80);
          auVar86 = minps(auVar86,auVar83);
          auVar88 = maxps(auVar88,auVar80);
          auVar71 = maxps(auVar88,auVar83);
          lVar52 = (long)(int)fVar95 * 0x38;
          lVar15 = *(long *)(lVar49 + lVar52);
          lVar16 = *(long *)(lVar49 + 0x10 + lVar52);
          auVar88 = *(undefined1 (*) [16])(lVar15 + lVar16 * uVar57);
          auVar80 = *(undefined1 (*) [16])(lVar15 + lVar16 * uVar43);
          auVar83 = *(undefined1 (*) [16])(lVar15 + lVar16 * uVar47);
          auVar92 = minps(auVar88,auVar80);
          auVar92 = minps(auVar92,auVar83);
          auVar88 = maxps(auVar88,auVar80);
          auVar88 = maxps(auVar88,auVar83);
          fVar84 = (float)local_1a58._M_allocated_capacity._0_4_ - fVar84;
          fVar97 = auVar92._0_4_;
          fVar89 = auVar86._0_4_;
          fVar74 = auVar88._0_4_;
          fVar75 = auVar88._4_4_;
          fVar76 = auVar88._8_4_;
          fVar78 = auVar88._12_4_;
          fVar69 = auVar71._0_4_;
          fVar70 = auVar71._4_4_;
          fVar77 = auVar71._8_4_;
          fVar81 = auVar71._12_4_;
          fVar93 = auVar86._4_4_;
          fVar94 = auVar86._8_4_;
          fVar96 = auVar86._12_4_;
          fVar64 = auVar92._4_4_;
          fVar67 = auVar92._8_4_;
          fVar68 = auVar92._12_4_;
          if (uVar17 - iVar28 == 1) {
            if (fVar84 <= 0.0) {
              fVar84 = 0.0;
            }
            fVar90 = 1.0 - fVar84;
            auVar60._4_4_ = fVar90 * fVar93 + fVar84 * fVar64;
            auVar60._0_4_ = fVar90 * fVar89 + fVar84 * fVar97;
            auVar63._0_4_ = fVar90 * fVar69 + fVar84 * fVar74;
            auVar63._4_4_ = fVar90 * fVar70 + fVar84 * fVar75;
            auVar63._8_4_ = fVar90 * fVar77 + fVar84 * fVar76;
            auVar63._12_4_ = fVar90 * fVar81 + fVar84 * fVar78;
            fVar95 = fVar95 - (float)local_1e38._0_4_;
            if (fVar95 <= 0.0) {
              fVar95 = 0.0;
            }
            fVar65 = 1.0 - fVar95;
            auVar62._0_4_ = fVar97 * fVar65 + fVar89 * fVar95;
            auVar62._4_4_ = fVar64 * fVar65 + fVar93 * fVar95;
            auVar62._8_4_ = fVar67 * fVar65 + fVar94 * fVar95;
            auVar62._12_4_ = fVar68 * fVar65 + fVar96 * fVar95;
            auVar66._0_4_ = fVar65 * fVar74 + fVar95 * fVar69;
            auVar66._4_4_ = fVar65 * fVar75 + fVar95 * fVar70;
            auVar66._8_4_ = fVar65 * fVar76 + fVar95 * fVar77;
            auVar66._12_4_ = fVar65 * fVar78 + fVar95 * fVar81;
            auVar60._8_4_ = fVar90 * fVar94 + fVar84 * fVar67;
            auVar60._12_4_ = fVar90 * fVar96 + fVar84 * fVar68;
          }
          else {
            lVar15 = *(long *)(lVar51 + lVar49 + 0x38);
            lVar16 = *(long *)(lVar51 + lVar49 + 0x48);
            auVar88 = *(undefined1 (*) [16])(lVar15 + lVar16 * uVar57);
            auVar80 = *(undefined1 (*) [16])(lVar15 + lVar16 * uVar43);
            auVar83 = *(undefined1 (*) [16])(lVar15 + lVar16 * uVar47);
            auVar86 = minps(auVar88,auVar80);
            auVar71 = minps(auVar86,auVar83);
            auVar88 = maxps(auVar88,auVar80);
            auVar86 = maxps(auVar88,auVar83);
            lVar15 = *(long *)(lVar52 + lVar49 + -0x38);
            lVar16 = *(long *)(lVar52 + lVar49 + -0x28);
            auVar88 = *(undefined1 (*) [16])(lVar15 + lVar16 * uVar57);
            auVar80 = *(undefined1 (*) [16])(lVar15 + lVar16 * uVar43);
            auVar83 = *(undefined1 (*) [16])(lVar15 + lVar16 * uVar47);
            auVar92 = minps(auVar88,auVar80);
            auVar92 = minps(auVar92,auVar83);
            auVar88 = maxps(auVar88,auVar80);
            auVar88 = maxps(auVar88,auVar83);
            if (fVar84 <= 0.0) {
              fVar84 = 0.0;
            }
            fVar65 = 1.0 - fVar84;
            auVar60._0_4_ = fVar89 * fVar65 + auVar71._0_4_ * fVar84;
            auVar60._4_4_ = fVar93 * fVar65 + auVar71._4_4_ * fVar84;
            auVar60._8_4_ = fVar94 * fVar65 + auVar71._8_4_ * fVar84;
            auVar60._12_4_ = fVar96 * fVar65 + auVar71._12_4_ * fVar84;
            auVar63._0_4_ = fVar65 * fVar69 + fVar84 * auVar86._0_4_;
            auVar63._4_4_ = fVar65 * fVar70 + fVar84 * auVar86._4_4_;
            auVar63._8_4_ = fVar65 * fVar77 + fVar84 * auVar86._8_4_;
            auVar63._12_4_ = fVar65 * fVar81 + fVar84 * auVar86._12_4_;
            fVar95 = fVar95 - (float)local_1e38._0_4_;
            if (fVar95 <= 0.0) {
              fVar95 = 0.0;
            }
            fVar84 = 1.0 - fVar95;
            auVar62._0_4_ = fVar97 * fVar84 + auVar92._0_4_ * fVar95;
            auVar62._4_4_ = fVar64 * fVar84 + auVar92._4_4_ * fVar95;
            auVar62._8_4_ = fVar67 * fVar84 + auVar92._8_4_ * fVar95;
            auVar62._12_4_ = fVar68 * fVar84 + auVar92._12_4_ * fVar95;
            auVar66._0_4_ = fVar84 * fVar74 + fVar95 * auVar88._0_4_;
            auVar66._4_4_ = fVar84 * fVar75 + fVar95 * auVar88._4_4_;
            auVar66._8_4_ = fVar84 * fVar76 + fVar95 * auVar88._8_4_;
            auVar66._12_4_ = fVar84 * fVar78 + fVar95 * auVar88._12_4_;
            uVar45 = iVar28 + 1;
            if ((int)uVar45 < (int)uVar17) {
              plVar50 = (long *)(lVar49 + (ulong)uVar45 * 0x38 + 0x10);
              do {
                fVar70 = ((float)(int)uVar45 / fVar90 - local_1e00[0]) /
                         (local_1e08._0_4_ - local_1e00[0]);
                fVar84 = 1.0 - fVar70;
                fVar93 = auVar62._4_4_;
                fVar94 = auVar62._12_4_;
                fVar77 = auVar62._8_4_;
                fVar89 = auVar60._4_4_;
                fVar95 = auVar60._12_4_;
                fVar81 = auVar60._8_4_;
                fVar67 = auVar66._4_4_;
                fVar68 = auVar66._8_4_;
                fVar69 = auVar66._12_4_;
                fVar96 = auVar63._4_4_;
                fVar97 = auVar63._8_4_;
                fVar64 = auVar63._12_4_;
                lVar15 = plVar50[-2];
                lVar49 = *plVar50;
                auVar88 = *(undefined1 (*) [16])(lVar15 + lVar49 * uVar57);
                auVar80 = *(undefined1 (*) [16])(lVar15 + lVar49 * uVar43);
                auVar83 = *(undefined1 (*) [16])(lVar15 + lVar49 * uVar47);
                auVar86 = minps(auVar88,auVar80);
                auVar86 = minps(auVar86,auVar83);
                auVar87._0_4_ = auVar86._0_4_ - (auVar60._0_4_ * fVar84 + auVar62._0_4_ * fVar70);
                auVar87._4_4_ = auVar86._4_4_ - (fVar89 * fVar84 + fVar93 * fVar70);
                auVar87._8_4_ = auVar86._8_4_ - (fVar81 * fVar84 + fVar77 * fVar70);
                auVar87._12_4_ = auVar86._12_4_ - (fVar95 * fVar84 + fVar94 * fVar70);
                auVar88 = maxps(auVar88,auVar80);
                auVar88 = maxps(auVar88,auVar83);
                auVar72._0_4_ = auVar88._0_4_ - (fVar84 * auVar63._0_4_ + fVar70 * auVar66._0_4_);
                auVar72._4_4_ = auVar88._4_4_ - (fVar84 * fVar96 + fVar70 * fVar67);
                auVar72._8_4_ = auVar88._8_4_ - (fVar84 * fVar97 + fVar70 * fVar68);
                auVar72._12_4_ = auVar88._12_4_ - (fVar84 * fVar64 + fVar70 * fVar69);
                auVar80 = minps(auVar87,ZEXT816(0));
                auVar88 = maxps(auVar72,ZEXT816(0));
                auVar60._0_4_ = auVar60._0_4_ + auVar80._0_4_;
                auVar60._4_4_ = fVar89 + auVar80._4_4_;
                auVar60._8_4_ = fVar81 + auVar80._8_4_;
                auVar60._12_4_ = fVar95 + auVar80._12_4_;
                auVar62._0_4_ = auVar62._0_4_ + auVar80._0_4_;
                auVar62._4_4_ = fVar93 + auVar80._4_4_;
                auVar62._8_4_ = fVar77 + auVar80._8_4_;
                auVar62._12_4_ = fVar94 + auVar80._12_4_;
                auVar63._0_4_ = auVar63._0_4_ + auVar88._0_4_;
                auVar63._4_4_ = fVar96 + auVar88._4_4_;
                auVar63._8_4_ = fVar97 + auVar88._8_4_;
                auVar63._12_4_ = fVar64 + auVar88._12_4_;
                auVar66._0_4_ = auVar66._0_4_ + auVar88._0_4_;
                auVar66._4_4_ = fVar67 + auVar88._4_4_;
                auVar66._8_4_ = fVar68 + auVar88._8_4_;
                auVar66._12_4_ = fVar69 + auVar88._12_4_;
                uVar45 = uVar45 + 1;
                plVar50 = plVar50 + 7;
              } while (uVar17 != uVar45);
            }
          }
          auVar73 = minps(auVar73,auVar60);
          local_1e80._8_16_ = maxps(local_1e80._8_16_,auVar63);
          register0x00001240 = minps(stack0xffffffffffffe198,auVar62);
          _local_1e28 = maxps(_local_1e28,auVar66);
          lVar44 = lVar44 + 1;
        } while (lVar44 != 4);
        local_1db8._0_16_ = maxps(local_1db8._0_16_,_local_1e28);
        local_1e48 = minps(local_1e48,register0x00001240);
        local_1b68 = maxps(local_1b68,local_1e80._8_16_);
        local_17d8 = minps(local_17d8,auVar73);
        lVar34 = lVar34 + 1;
      } while (lVar34 != uVar42 + (uVar42 == 0));
    }
    *(ulong *)local_1e10._M_p = uVar48 | (ulong)pcVar41 | 8;
    *(undefined1 (*) [16])(((LBBox3fa *)(local_1e10._M_p + 0x10))->bounds0).lower.field_0.m128 =
         local_17d8;
    *(undefined8 *)&((Vec3fa *)(local_1e10._M_p + 0x20))->field_0 = local_1b68._0_8_;
    *(undefined8 *)(local_1e10._M_p + 0x28) = local_1b68._8_8_;
    *(undefined8 *)&(((BBox<embree::Vec3fa> *)(local_1e10._M_p + 0x30))->lower).field_0 =
         local_1e48._0_8_;
    *(undefined8 *)(local_1e10._M_p + 0x38) = local_1e48._8_8_;
    *(undefined8 *)&((Vec3fa *)(local_1e10._M_p + 0x40))->field_0 = local_1db8._0_8_;
    *(undefined8 *)(local_1e10._M_p + 0x48) = local_1db8._8_8_;
    *(BBox1f *)(local_1e10._M_p + 0x50) =
         current.super_BuildRecord.prims.super_PrimInfoMB.time_range;
    return (NodeRecordMB4D *)local_1e10._M_p;
  }
  lVar34 = 0xbc;
  do {
    *(undefined8 *)(local_17d8 + lVar34 + 4) = 0xffffffff7f800000;
    *(undefined8 *)(local_17d8 + lVar34 + 0xc) = 0;
    lVar34 = lVar34 + 0xf0;
  } while (lVar34 != 0xfbc);
  local_848 = (Device *)0x1;
  local_840._512_8_ = 1;
  local_17b8 = (anon_union_16_2_47237d3f_for_Vec3fa_0)local_1e38;
  local_1798 = (anon_union_16_2_47237d3f_for_Vec3fa_0)local_1e80._8_16_;
  local_1788._M_allocated_capacity = local_1e80._24_8_;
  local_1788._8_8_ = aStack_1e60._M_allocated_capacity;
  local_1778.m128[0] = (float)local_1e28._0_4_;
  local_1778.m128[1] = (float)local_1e28._4_4_;
  local_1778.m128[2] = (float)aStack_1e20._M_allocated_capacity._0_4_;
  local_1778.m128[3] = (float)aStack_1e20._M_allocated_capacity._4_4_;
  local_1748._8_8_ = values[0]._8_8_;
  local_1748._M_allocated_capacity = values[0].ref.ptr;
  local_1758._M_p = pcVar30;
  pcStack_1750 = pcVar5;
  local_1738.lower = (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
  local_1738.upper = (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
  fStack_1730 = (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  fStack_172c = (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
  local_1728._M_allocated_capacity = (size_type)pmVar6;
  local_1718._0_8_ = v0.field_0.v[0];
  local_1718._8_8_ = v0.field_0.v[1];
  local_16f8._M_p = (pointer)local_17a8._M_allocated_capacity;
  sStack_16f0 = local_17a8._8_8_;
  local_840._0_8_ = pmVar6;
  local_840._8_8_ = 2;
  local_8c8[0] = (FastAllocator *)local_840;
  local_1e80._24_8_ = &local_1bc8;
  local_1e28 = (undefined1  [8])local_1a98;
  local_1e50._M_p = (pointer)&this->heuristicTemporalSplit;
  local_1e00 = (float  [2])(auStack_1c00 + 8);
  local_1e08 = (undefined1 (*) [16])local_1ac8;
  local_1dd8._8_8_ = 0x7f8000007f800000;
  local_1dd8._0_8_ = 0x7f8000007f800000;
  local_1e38._8_8_ = 0xff800000ff800000;
  local_1e38._0_8_ = 0xff800000ff800000;
  uVar57 = 0;
  v0.field_0.v[0] = uVar42;
  local_17a8 = aVar20;
  local_1768 = aVar21;
  do {
    if (local_848 == (Device *)0x0) goto LAB_00c41554;
    pDVar58 = (Device *)0xffffffffffffffff;
    p_Var38 = &local_1758;
    uVar42 = 0;
    uVar46 = (Device *)0x0;
    do {
      uVar48 = (long)p_Var38[1]._M_p - (long)p_Var38->_M_p;
      if ((((this->cfg).maxLeafSize < uVar48) || (1 < *(uint *)((long)&p_Var38[9]._M_p + 4))) ||
         (bVar19)) {
        if (uVar42 < uVar48) {
          pDVar58 = (Device *)uVar46;
          uVar42 = uVar48;
        }
        bVar19 = false;
      }
      uVar46 = (long)(((LBBox<embree::Vec3fa> *)&(((Device *)uVar46)->super_State).super_RefCount)->
                     bounds0).lower.field_0.m128 + 1;
      p_Var38 = p_Var38 + 0x1e;
    } while (local_848 != (Device *)uVar46);
    if (pDVar58 == (Device *)0xffffffffffffffff) goto LAB_00c4150a;
    lVar34 = (long)pDVar58 * 0xf0;
    v2.field_0.v[0] = current.super_BuildRecord.depth + 1;
    local_1bc8._M_p = (pointer)0xffffffff7f800000;
    auStack_1bc0._0_8_ = 0;
    local_1a98._0_8_ = 0xffffffff7f800000;
    local_1a98._8_8_ = 0;
    pSVar4 = (Split *)(local_1718 + lVar34);
    iVar28 = *(int *)(local_1718 + (long)pDVar58 * 0xf0 + 0xc);
    local_1e80._8_8_ = &v0 + (long)pDVar58 * 0xf;
    local_1a58._M_allocated_capacity = uVar57;
    geomID.field_0.v[0] = v2.field_0.v[0];
    if (iVar28 == 0) {
      begin._M_p = (&local_1758)[(long)pDVar58 * 0x1e]._M_p;
      sVar36 = *(size_t *)(local_1748._M_local_buf + lVar34 + -8);
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0xff800000ff800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._8_8_ =
           0xff800000ff800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_ =
           0xff800000ff800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._8_8_ =
           0xff800000ff800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
           0xff800000ff800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
           0xff800000ff800000;
      left.max_time_range.lower = 0.0;
      left.num_time_segments = 0;
      left.max_num_time_segments = 0;
      left.object_range._begin = 0;
      left.object_range._end = 0;
      left.max_time_range.upper = 1.0;
      left.time_range.lower = 1.0;
      left.time_range.upper = 0.0;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._8_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._8_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
           0xff800000ff800000;
      right.max_time_range.lower = 0.0;
      right.num_time_segments = 0;
      right.max_num_time_segments = 0;
      right.object_range._begin = 0;
      right.object_range._end = 0;
      right.max_time_range.upper = 1.0;
      right.time_range.lower = 1.0;
      right.time_range.upper = 0.0;
      vSplitPos.field_0.i[1] = *(undefined4 *)(local_1718 + (long)pDVar58 * 0xf0 + 8);
      vSplitPos.field_0.i[0] = vSplitPos.field_0.i[1];
      vSplitPos.field_0.i[3] = vSplitPos.field_0.i[1];
      vSplitPos.field_0.i[2] = vSplitPos.field_0.i[1];
      lVar34 = (long)(1 << (local_1718[lVar34 + 4] & 0x1f)) * 0x10;
      vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar34);
      vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar34 + 8);
      isLeft.vSplitPos = &vSplitPos;
      isLeft.vSplitMask = &vSplitMask;
      isLeft.split = pSVar4;
      auStack_1c00._0_8_ =
           parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                     (*(PrimRefMB **)
                       (*(long *)(local_1728._M_local_buf + (long)pDVar58 * 0xf0) + 0x20),
                      (size_t)begin._M_p,sVar36,(EmptyTy *)local_19e8,&left,&right,&isLeft,
                      &reduction,&reduction2,0x80,0xc00);
      pDVar7 = *(Device **)(local_1728._M_local_buf + (long)pDVar58 * 0xf0);
      uVar42 = *(ulong *)(local_1728._M_local_buf + ((long)pDVar58 * 0x1e + -1) * 8);
      local_1c38._8_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
           _8_8_;
      local_1c38._M_allocated_capacity =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
           _0_8_;
      local_1c68._0_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      local_1c68._8_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _8_8_;
      local_1c58._M_allocated_capacity =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
           _0_8_;
      local_1c58._8_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
           _8_8_;
      local_1c48._0_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
           _0_8_;
      local_1c48._8_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
           _8_8_;
      local_1c28._0_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_;
      local_1c28._8_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_;
      local_1c18._M_allocated_capacity =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_;
      local_1c18._8_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_;
      *(size_t *)((long)local_1e00 + 0x10) =
           CONCAT44(left.max_time_range.upper,left.max_time_range.lower);
      *(size_t *)((long)local_1e00 + 0x18) = CONCAT44(left.time_range.upper,left.time_range.lower);
      *(size_t *)local_1e00 = left.num_time_segments;
      *(size_t *)((long)local_1e00 + 8) = left.max_num_time_segments;
      fVar84 = (float)uVar42;
      fVar90 = fVar84;
      if (fVar84 <= fStack_1be0) {
        fVar90 = fStack_1be0;
      }
      fVar89 = (float)(uVar42 >> 0x20);
      if (fVar89 <= fStack_1bdc) {
        fStack_1bdc = fVar89;
      }
      fStack_1be0 = fVar90;
      local_1b38._0_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      local_1b38._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _8_8_;
      local_1b28._0_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
           _0_8_;
      local_1b28._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
           _8_8_;
      local_1b18._M_allocated_capacity =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
           _0_8_;
      local_1b18._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
           _8_8_;
      local_1b08._0_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
           _0_8_;
      local_1b08._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
           _8_8_;
      local_1af8._M_allocated_capacity =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_;
      local_1af8._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_;
      local_1ae8._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_;
      local_1ae8._0_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_;
      *(ulong *)local_1e08[1] = CONCAT44(right.max_time_range.upper,right.max_time_range.lower);
      *(ulong *)(local_1e08[1] + 8) = CONCAT44(right.time_range.upper,right.time_range.lower);
      *(size_t *)*local_1e08 = right.num_time_segments;
      *(size_t *)(*local_1e08 + 8) = right.max_num_time_segments;
      if (fVar84 <= (float)local_1ab8._8_4_) {
        uVar42 = local_1ab8._8_8_ & 0xffffffff;
      }
      if (fVar89 <= (float)local_1ab8._12_4_) {
        local_1ab8._12_4_ = fVar89;
      }
      local_1ab8._8_8_ = CONCAT44(local_1ab8._12_4_,(int)uVar42);
      this_01 = this;
      local_1c08._M_p = begin._M_p;
      local_1bd8._M_allocated_capacity = (size_type)pDVar7;
      local_1ad8._0_8_ = auStack_1c00._0_8_;
      local_1ad8._8_8_ = sVar36;
      local_1ab8._16_8_ = pDVar7;
LAB_00c407db:
      local_1e80._0_8_ = (Device *)0x0;
      bVar59 = false;
    }
    else {
      this_00 = &local_17b8 + (long)pDVar58 * 0xf;
      local_1e48._0_8_ = this_00;
      if (iVar28 != 2) {
        if (iVar28 == 1) {
          SetMB::deterministic_order((SetMB *)&this_00->field_1);
          splitFallback(this,(SetMB *)local_1e48._0_8_,(SetMB *)local_1c68,(SetMB *)local_1b38);
          this_01 = this;
        }
        else {
          this_01 = this;
          if (iVar28 == 3) {
            SetMB::deterministic_order((SetMB *)&this_00->field_1);
            splitByGeometry(this,(SetMB *)local_1e48._0_8_,(SetMB *)local_1c68,(SetMB *)local_1b38);
            this_01 = this;
          }
        }
        goto LAB_00c407db;
      }
      time_range1.lower = *(float *)(local_1718 + (long)pDVar58 * 0xf0 + 8);
      time_range0.lower = *(float *)(local_1728._M_local_buf + ((long)pDVar58 * 0x1e + -1) * 8);
      time_range1.upper = *(float *)((long)&local_1728 + ((long)pDVar58 * 0x1e + -1) * 8 + 4);
      pDVar7 = *(Device **)(local_1728._M_local_buf + (long)pDVar58 * 0xf0);
      time_range0.upper = time_range1.lower;
      pDVar29 = (Device *)operator_new(0x28);
      puVar32 = *(undefined8 **)local_1e50._M_p;
      pSVar39 = *(Split **)(local_1748._M_local_buf + lVar34 + -8);
      (pDVar29->super_State).super_RefCount._vptr_RefCount = (_func_int **)puVar32;
      *(undefined1 *)
       &(pDVar29->super_State).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0
      ;
      (pDVar29->super_State).tri_accel._M_dataplus._M_p = (pointer)0x0;
      (pDVar29->super_State).tri_accel._M_string_length = 0;
      (pDVar29->super_State).tri_accel.field_2._M_allocated_capacity = 0;
      pcVar30 = (pointer)((long)pSVar39 - (long)(&local_1758)[(long)pDVar58 * 0x1e]._M_p);
      pSVar53 = pSVar39;
      this_01 = this;
      if (pcVar30 != (pointer)0x0) {
        uVar42 = (long)pcVar30 * 0x50;
        (**(code **)*puVar32)(puVar32,uVar42,0);
        if (uVar42 < 0x1c00000) {
          pvVar31 = alignedMalloc(uVar42,0x10);
        }
        else {
          pvVar31 = os_malloc(uVar42,(bool *)&(pDVar29->super_State).super_RefCount.refCounter);
        }
        (pDVar29->super_State).tri_accel.field_2._M_allocated_capacity = (size_type)pvVar31;
        (pDVar29->super_State).tri_accel._M_dataplus._M_p = pcVar30;
        (pDVar29->super_State).tri_accel._M_string_length = (size_type)pcVar30;
        pSVar39 = *(Split **)(local_1e80._8_8_ + 0x70);
        pSVar53 = *(Split **)(local_1e80._8_8_ + 0x78);
        this_01 = this;
      }
      pvVar22 = isLeft.vSplitPos;
      vSplitMask.field_0._8_8_ = &time_range0;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._8_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._8_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
           0xff800000ff800000;
      right.max_time_range.lower = 0.0;
      right.num_time_segments = 0;
      right.max_num_time_segments = 0;
      right.object_range._begin = 0;
      right.object_range._end = 0;
      right.max_time_range.upper = 1.0;
      right.time_range.lower = 1.0;
      right.time_range.upper = 0.0;
      local_1e80._0_8_ = pDVar29;
      vSplitMask.field_0._0_8_ = pDVar7;
      if ((ulong)((long)pSVar53 - (long)pSVar39) < 0xc00) {
        isLeft.split = pSVar39;
        isLeft.vSplitPos = (vint *)pSVar53;
        ::anon_func::anon_class_40_5_808acc65::operator()
                  (&left,(anon_class_40_5_808acc65 *)&vSplitMask,(range<unsigned_long> *)&isLeft);
      }
      else {
        isLeft.vSplitPos._6_2_ = SUB82(pvVar22,6);
        isLeft.vSplitPos._0_6_ = CONCAT15(4,CONCAT14(1,isLeft.vSplitPos._0_4_));
        tbb::detail::r1::initialize((task_group_context *)&isLeft);
        _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        vSplitPos.field_0.v[0] = (longlong)pSVar53;
        vSplitPos.field_0.v[1] = (longlong)pSVar39;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  (&left,(d1 *)&vSplitPos,(blocked_range<unsigned_long> *)&right,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                   (anon_class_16_2_ed117de8_conflict29 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&isLeft,(task_group_context *)this_01);
        cVar27 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
        if (cVar27 != '\0') {
          prVar33 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar33,"task cancelled");
          __cxa_throw(prVar33,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::r1::destroy((task_group_context *)&isLeft);
      }
      lVar34 = *(long *)(local_1e80._8_8_ + 0x70);
      pcVar54 = *(code **)(local_1e80._8_8_ + 0x78);
      uVar42 = (long)pcVar54 - lVar34;
      if (left.object_range._end - left.object_range._begin != uVar42) {
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
             = &time_range0;
        left.object_range._end =
             parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                       ((PrimRefMB *)(pDVar29->super_State).tri_accel.field_2._M_allocated_capacity,
                        0,uVar42,0x400,(anon_class_8_1_41ce32a5 *)&right);
        lVar34 = *(long *)(local_1e80._8_8_ + 0x70);
        pcVar54 = *(code **)(local_1e80._8_8_ + 0x78);
        uVar42 = (long)pcVar54 - lVar34;
      }
      *(size_t *)local_1e00 = left.num_time_segments;
      *(size_t *)((long)local_1e00 + 8) = left.max_num_time_segments;
      uVar46 = vSplitPos.field_0.v[1];
      local_1c68._0_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      local_1c68._8_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _8_8_;
      local_1c58._M_allocated_capacity =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
           _0_8_;
      local_1c58._8_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
           _8_8_;
      local_1c48._0_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
           _0_8_;
      local_1c48._8_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
           _8_8_;
      local_1c38._8_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
           _8_8_;
      local_1c38._M_allocated_capacity =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
           _0_8_;
      local_1c28._0_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_;
      local_1c28._8_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_;
      local_1c18._M_allocated_capacity =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_;
      local_1c18._8_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_;
      local_1c08._M_p = (pointer)left.object_range._begin;
      local_1be8.upper = left.max_time_range.upper;
      local_1be8.lower = left.max_time_range.lower;
      _fStack_1be0 = CONCAT44(~-(uint)(left.time_range.upper < time_range0.upper) &
                              (uint)time_range0.upper,
                              ~-(uint)(left.time_range.lower < time_range0.lower) &
                              (uint)left.time_range.lower) |
                     CONCAT44((uint)left.time_range.upper &
                              -(uint)(left.time_range.upper < time_range0.upper),
                              (uint)time_range0.lower &
                              -(uint)(left.time_range.lower < time_range0.lower));
      isLeft.split = (Split *)0x7f8000007f800000;
      isLeft.vSplitPos = (vint *)0x7f8000007f800000;
      isLeft.vSplitMask = (vbool *)0xff800000ff800000;
      auStack_1c00._0_8_ = left.object_range._end;
      local_1bd8._M_allocated_capacity = (size_type)pDVar29;
      _reduction2 = pDVar7;
      if (uVar42 < 0xc00) {
        vSplitPos.field_0.v[0] = lVar34;
        vSplitPos.field_0.v[1] = (longlong)pcVar54;
        ::anon_func::anon_class_24_3_35f68c7c::operator()
                  (&right,(anon_class_24_3_35f68c7c *)&reduction2,(range<unsigned_long> *)&vSplitPos
                  );
      }
      else {
        vSplitPos.field_0.v[1]._4_1_ = 1;
        vSplitPos.field_0.v[1]._6_2_ = SUB82(uVar46,6);
        vSplitPos.field_0.v[1]._5_1_ = 4;
        tbb::detail::r1::initialize((task_group_context *)&vSplitPos);
        local_19e8._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        local_19e8._8_8_ = &reduction2;
        _reduction = pcVar54;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  (&right,(d1 *)&reduction,(blocked_range<unsigned_long> *)&isLeft,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_19e8,
                   (anon_class_16_2_ed117de8_conflict30 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&vSplitPos,(task_group_context *)this_01);
        cVar27 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos);
        if (cVar27 != '\0') {
          prVar33 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar33,"task cancelled");
          __cxa_throw(prVar33,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::r1::destroy((task_group_context *)&vSplitPos);
      }
      lVar34 = right.object_range._end - right.object_range._begin;
      right.object_range._begin = *(unsigned_long *)(local_1e80._8_8_ + 0x70);
      right.object_range._end = lVar34 + right.object_range._begin;
      if (lVar34 != *(unsigned_long *)(local_1e80._8_8_ + 0x78) - right.object_range._begin) {
        isLeft.split = (Split *)&time_range1;
        right.object_range._end =
             parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                       ((PrimRefMB *)(pDVar7->super_State).tri_accel.field_2._M_allocated_capacity,
                        right.object_range._begin,*(unsigned_long *)(local_1e80._8_8_ + 0x78),0x400,
                        (anon_class_8_1_41ce32a6 *)&isLeft);
      }
      local_1b38._0_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      local_1b38._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _8_8_;
      local_1b28._0_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
           _0_8_;
      local_1b28._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
           _8_8_;
      local_1b18._M_allocated_capacity =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
           _0_8_;
      local_1b18._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
           _8_8_;
      local_1b08._0_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
           _0_8_;
      local_1b08._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
           _8_8_;
      local_1ae8._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_;
      local_1ae8._0_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_;
      auVar88._8_8_ = right.max_num_time_segments;
      auVar88._0_8_ = right.num_time_segments;
      *local_1e08 = auVar88;
      local_1af8._M_allocated_capacity =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_;
      local_1af8._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_;
      local_1ab8._4_4_ = right.max_time_range.upper;
      local_1ab8._0_4_ = right.max_time_range.lower;
      local_1ab8._8_8_ =
           CONCAT44(~-(uint)(right.time_range.upper < time_range1.upper) & (uint)time_range1.upper,
                    ~-(uint)(right.time_range.lower < time_range1.lower) &
                    (uint)right.time_range.lower) |
           CONCAT44((uint)right.time_range.upper &
                    -(uint)(right.time_range.upper < time_range1.upper),
                    (uint)time_range1.lower & -(uint)(right.time_range.lower < time_range1.lower));
      bVar59 = (Device *)local_1e80._0_8_ != (Device *)0x0;
      local_1ad8._0_8_ = right.object_range._begin;
      local_1ad8._8_8_ = right.object_range._end;
      local_1ab8._16_8_ = pDVar7;
    }
    uVar46 = &left;
    this = this_01;
    findFallback((Split *)uVar46,this_01,(SetMB *)local_1c68);
    *(undefined8 *)local_1e80._24_8_ =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
    *(undefined8 *)(local_1e80._24_8_ + 8) =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_;
    auStack_1bc0._8_8_ =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_;
    local_1ba8._M_p =
         (pointer)left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                  field_0._0_8_;
    auStack_1ba0._0_8_ =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_;
    auStack_1ba0._8_8_ =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_;
    auStack_1ba0._16_8_ =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._8_8_;
    findFallback((Split *)uVar46,this_01,(SetMB *)local_1b38);
    uVar35 = local_840._512_8_;
    *(undefined8 *)local_1e28 =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
    *(undefined8 *)((long)local_1e28 + 8) =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_;
    local_1a98._16_8_ =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_;
    local_1a78._0_8_ =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_;
    local_1a78._8_8_ =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_;
    local_1a78._16_8_ =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_;
    _Stack_1a60._M_p =
         (pointer)left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                  field_0._8_8_;
    local_1e80._0_8_ =
         (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
          *)0x0;
    pFVar8 = local_8c8[(long)pDVar58];
    if ((Device *)local_1bd8._M_allocated_capacity == pFVar8->device) {
      pFVar8->slotMask = pFVar8->slotMask + 1;
      uVar35 = local_1bd8._M_allocated_capacity;
    }
    else {
      local_840._512_8_ = local_840._512_8_ + 1;
      uVar46 = local_840;
      *(size_type *)
       ((long)&(((LBBox<embree::Vec3fa> *)&(((Device *)uVar46)->super_State).super_RefCount)->
               bounds0).lower + uVar35 * 0x10) = local_1bd8._M_allocated_capacity;
      *(undefined8 *)(local_840 + uVar35 * 0x10 + 8) = 1;
      local_8c8[(long)pDVar58] =
           (FastAllocator *)
           ((long)&(((LBBox<embree::Vec3fa> *)&(((Device *)uVar46)->super_State).super_RefCount)->
                   bounds0).lower + uVar35 * 0x10);
      uVar35 = pFVar8->device;
    }
    uVar18 = local_840._512_8_;
    if (local_1ab8._16_8_ == uVar35) {
      local_8c8[(long)local_848] = pFVar8;
      sVar36 = pFVar8->slotMask;
      pFVar8->slotMask = sVar36 + 1;
    }
    else {
      local_840._512_8_ = local_840._512_8_ + 1;
      uVar46 = local_840;
      *(undefined8 *)
       ((long)&(((LBBox<embree::Vec3fa> *)&(((Device *)uVar46)->super_State).super_RefCount)->
               bounds0).lower + uVar18 * 0x10) = local_1ab8._16_8_;
      *(undefined8 *)(local_840 + uVar18 * 0x10 + 8) = 1;
      local_8c8[(long)local_848] =
           (FastAllocator *)
           ((long)&(((LBBox<embree::Vec3fa> *)&(((Device *)uVar46)->super_State).super_RefCount)->
                   bounds0).lower + uVar18 * 0x10);
      sVar36 = pFVar8->slotMask - 1;
    }
    pFVar8->slotMask = sVar36;
    if (sVar36 == 0) {
      uVar46 = pFVar8->device;
      if ((Device *)uVar46 != (Device *)0x0) {
        lVar34 = *(long *)&((BinMapping<32UL> *)&(((Device *)uVar46)->super_State).tri_accel)->
                           field_0x8;
        pvVar31 = *(void **)&(((BinMapping<32UL> *)&(((Device *)uVar46)->super_State).tri_accel)->
                             ofs).field_0;
        if (pvVar31 != (void *)0x0) {
          if ((ulong)(lVar34 * 0x50) < 0x1c00000) {
            alignedFree(pvVar31);
          }
          else {
            os_free(pvVar31,lVar34 * 0x50,
                    *(bool *)((long)&(((LBBox<embree::Vec3fa> *)
                                      &(((Device *)uVar46)->super_State).super_RefCount)->bounds0).
                                     lower + 8));
          }
        }
        if (lVar34 != 0) {
          puVar32 = *(undefined8 **)
                     &(((LBBox<embree::Vec3fa> *)&(((Device *)uVar46)->super_State).super_RefCount)
                      ->bounds0).lower.field_0;
          (**(code **)*puVar32)(puVar32,lVar34 * -0x50,1);
        }
        ((BinMapping<32UL> *)&(((Device *)uVar46)->super_State).tri_accel)->num = 0;
        *(undefined8 *)
         &((BinMapping<32UL> *)&(((Device *)uVar46)->super_State).tri_accel)->field_0x8 = 0;
        *(undefined8 *)
         &(((BinMapping<32UL> *)&(((Device *)uVar46)->super_State).tri_accel)->ofs).field_0 = 0;
      }
      operator_delete((void *)uVar46);
    }
    *(longlong *)local_1e80._8_8_ = v2.field_0.v[0];
    *(undefined8 *)(local_1e80._8_8_ + 0x10) = local_1c68._0_8_;
    *(undefined8 *)(local_1e80._8_8_ + 0x18) = local_1c68._8_8_;
    *(size_type *)(local_1e80._8_8_ + 0x20) = local_1c58._M_allocated_capacity;
    *(undefined8 *)(local_1e80._8_8_ + 0x28) = local_1c58._8_8_;
    *(undefined8 *)(local_1e80._8_8_ + 0x30) = local_1c48._0_8_;
    *(undefined8 *)(local_1e80._8_8_ + 0x38) = local_1c48._8_8_;
    *(size_type *)(local_1e80._8_8_ + 0x40) = local_1c38._M_allocated_capacity;
    *(undefined8 *)(local_1e80._8_8_ + 0x48) = local_1c38._8_8_;
    ((BBox1f *)(local_1e80._8_8_ + 0x50))->lower = (float)local_1c28._0_4_;
    ((BBox1f *)(local_1e80._8_8_ + 0x50))->upper = (float)local_1c28._4_4_;
    *(undefined8 *)(local_1e80._8_8_ + 0x58) = local_1c28._8_8_;
    *(size_type *)(local_1e80._8_8_ + 0x60) = local_1c18._M_allocated_capacity;
    *(undefined8 *)(local_1e80._8_8_ + 0x68) = local_1c18._8_8_;
    *(pointer *)(local_1e80._8_8_ + 0x70) = local_1c08._M_p;
    *(undefined8 *)(local_1e80._8_8_ + 0x78) = auStack_1c00._0_8_;
    *(undefined8 *)(local_1e80._8_8_ + 0x80) = auStack_1c00._8_8_;
    *(undefined8 *)(local_1e80._8_8_ + 0x88) = auStack_1c00._16_8_;
    *(BBox1f *)(local_1e80._8_8_ + 0x90) = local_1be8;
    ((BBox1f *)(local_1e80._8_8_ + 0x98))->lower = fStack_1be0;
    ((BBox1f *)(local_1e80._8_8_ + 0x98))->upper = fStack_1bdc;
    *(size_type *)(local_1e80._8_8_ + 0xa0) = local_1bd8._M_allocated_capacity;
    uVar35 = *(undefined8 *)local_1e80._24_8_;
    uVar18 = *(undefined8 *)(local_1e80._24_8_ + 8);
    pSVar4->sah = (float)(int)uVar35;
    pSVar4->dim = (int)((ulong)uVar35 >> 0x20);
    *(undefined8 *)(local_1718 + (long)pDVar58 * 0xf0 + 8) = uVar18;
    pDVar58 = local_848;
    *(undefined8 *)(local_1e80._8_8_ + 0xc0) = auStack_1bc0._8_8_;
    *(pointer *)(local_1e80._8_8_ + 0xd0) = local_1ba8._M_p;
    *(undefined8 *)(local_1e80._8_8_ + 0xd8) = auStack_1ba0._0_8_;
    *(undefined8 *)(local_1e80._8_8_ + 0xe0) = auStack_1ba0._8_8_;
    *(undefined8 *)(local_1e80._8_8_ + 0xe8) = auStack_1ba0._16_8_;
    lVar34 = (long)local_848 * 0xf0;
    (&v0)[(long)local_848 * 0xf].field_0.v[0] = geomID.field_0.v[0];
    *(undefined8 *)(&local_17b8 + (long)pDVar58 * 0xf) = local_1b38._0_8_;
    *(undefined8 *)((long)&local_17b8 + lVar34 + 8) = local_1b38._8_8_;
    *(undefined8 *)(local_17a8._M_local_buf + (long)pDVar58 * 0xf0) = local_1b28._0_8_;
    *(undefined8 *)((long)&local_17a8 + lVar34 + 8) = local_1b28._8_8_;
    *(size_type *)(&local_1798 + (long)pDVar58 * 0xf) = local_1b18._M_allocated_capacity;
    *(undefined8 *)((long)&local_1798 + lVar34 + 8) = local_1b18._8_8_;
    *(undefined8 *)(local_1788._M_local_buf + (long)pDVar58 * 0xf0) = local_1b08._0_8_;
    *(undefined8 *)((long)&local_1788 + lVar34 + 8) = local_1b08._8_8_;
    *(size_type *)(&local_1778 + (long)pDVar58 * 0xf) = local_1af8._M_allocated_capacity;
    *(undefined8 *)((long)&local_1778 + lVar34 + 8) = local_1af8._8_8_;
    *(undefined8 *)(local_1768._M_local_buf + (long)pDVar58 * 0xf0) = local_1ae8._0_8_;
    *(undefined8 *)((long)&local_1768 + lVar34 + 8) = local_1ae8._8_8_;
    (&local_1758)[(long)pDVar58 * 0x1e]._M_p = (pointer)local_1ad8._0_8_;
    *(undefined8 *)(local_1748._M_local_buf + lVar34 + -8) = local_1ad8._8_8_;
    *(undefined1 (*) [8])(local_1748._M_local_buf + lVar34) = local_1ac8;
    *(pointer *)(local_1748._M_local_buf + lVar34 + 8) = _Stack_1ac0._M_p;
    (&local_1738)[(long)pDVar58 * 0x1e].lower = (float)local_1ab8._0_4_;
    (&local_1738)[(long)pDVar58 * 0x1e].upper = (float)local_1ab8._4_4_;
    *(undefined8 *)(local_1728._M_local_buf + ((long)pDVar58 * 0x1e + -1) * 8) = local_1ab8._8_8_;
    *(undefined8 *)(local_1728._M_local_buf + (long)pDVar58 * 0xf0) = local_1ab8._16_8_;
    uVar35 = *(undefined8 *)((long)local_1e28 + 8);
    *(undefined8 *)(local_1718 + lVar34) = *(undefined8 *)local_1e28;
    *(undefined8 *)(local_1718 + (long)pDVar58 * 0xf0 + 8) = uVar35;
    *(undefined8 *)(local_1718 + ((long)pDVar58 * 0x1e + 1) * 8 + 8) = local_1a98._16_8_;
    *(undefined8 *)(local_1718 + ((long)pDVar58 * 0x1e + 3) * 8 + 8) = local_1a78._0_8_;
    *(undefined8 *)(local_1718 + ((long)pDVar58 * 0x1e + 4) * 8 + 8) = local_1a78._8_8_;
    *(undefined8 *)(local_1718 + ((long)pDVar58 * 0x1e + 5) * 8 + 8) = local_1a78._16_8_;
    *(pointer *)(local_1718 + ((long)pDVar58 * 0x1e + 6) * 8 + 8) = _Stack_1a60._M_p;
    local_848 = (Device *)
                ((long)&(((LBBox<embree::Vec3fa> *)&(local_848->super_State).super_RefCount)->
                        bounds0).lower.field_0 + 1);
    if ((vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
         *)local_1e80._0_8_ !=
        (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
         *)0x0) {
      uVar46 = local_1e80;
      std::
      default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
      ::operator()((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                    *)uVar46,
                   (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                    *)local_1e80._0_8_);
    }
    uVar57 = CONCAT71(local_1a58._1_7_,local_1a58._M_local_buf[0] | bVar59);
  } while (local_848 < (Device *)(this->cfg).branchingFactor);
  if (local_848 != (Device *)0x0) {
LAB_00c4150a:
    pfVar37 = &fStack_172c;
    pDVar58 = local_848;
    do {
      uVar57 = (ulong)(byte)((byte)uVar57 |
                            -(*pfVar37 < (in->prims).super_PrimInfoMB.time_range.upper ||
                             (in->prims).super_PrimInfoMB.time_range.lower < pfVar37[-1]));
      pfVar37 = pfVar37 + 0x3c;
      pDVar58 = (Device *)
                ((long)&pDVar58[-1].bvh8_factory._M_t.
                        super___uniq_ptr_impl<embree::BVH8Factory,_std::default_delete<embree::BVH8Factory>_>
                        ._M_t + 7);
    } while (pDVar58 != (Device *)0x0);
  }
LAB_00c41554:
  in_00 = (BuildRecord *)&v0;
  if ((uVar57 & 1) == 0) {
    right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         0xe0;
    pTVar9 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar9->alloc)._M_b._M_p) {
      geomID.field_0.v[1]._0_1_ = 1;
      geomID.field_0.v[0] = (longlong)pTVar9;
      MutexSys::lock(&pTVar9->mutex);
      if ((pTVar9->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar2 = &((pTVar9->alloc)._M_b._M_p)->bytesUsed;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar9->alloc1).bytesUsed + (pTVar9->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar9->alloc)._M_b._M_p)->bytesFree;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar9->alloc0).end + (pTVar9->alloc1).end) -
             ((pTVar9->alloc0).cur + (pTVar9->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar9->alloc)._M_b._M_p)->bytesWasted;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar9->alloc1).bytesWasted + (pTVar9->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar9->alloc0).bytesUsed = 0;
      (pTVar9->alloc0).bytesWasted = 0;
      (pTVar9->alloc0).end = 0;
      (pTVar9->alloc0).allocBlockSize = 0;
      (pTVar9->alloc0).ptr = (char *)0x0;
      (pTVar9->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar9->alloc1).bytesUsed = 0;
        (pTVar9->alloc1).bytesWasted = 0;
        (pTVar9->alloc1).end = 0;
        (pTVar9->alloc1).allocBlockSize = 0;
        (pTVar9->alloc1).ptr = (char *)0x0;
        (pTVar9->alloc1).cur = 0;
      }
      else {
        (pTVar9->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar9->alloc1).ptr = (char *)0x0;
        (pTVar9->alloc1).cur = 0;
        (pTVar9->alloc1).end = 0;
        (pTVar9->alloc1).allocBlockSize = 0;
        (pTVar9->alloc1).bytesUsed = 0;
        (pTVar9->alloc1).bytesWasted = 0;
        (pTVar9->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar9->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      v2.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
      v2.field_0.v[1]._0_1_ = 1;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           pTVar9;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar10._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar10._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar10,(ThreadLocal2 **)&left);
      }
      else {
        *iVar10._M_current =
             (ThreadLocal2 *)
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        pppTVar3 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar3 = *pppTVar3 + 1;
      }
      MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      if (geomID.field_0.v[1]._0_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)geomID.field_0.v[0]);
      }
    }
    (alloc.talloc0)->bytesUsed =
         (alloc.talloc0)->bytesUsed +
         right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
    ;
    sVar36 = (alloc.talloc0)->cur;
    uVar42 = (ulong)(-(int)sVar36 & 0xf);
    uVar57 = sVar36 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0._0_8_ + uVar42;
    (alloc.talloc0)->cur = uVar57;
    if ((alloc.talloc0)->end < uVar57) {
      (alloc.talloc0)->cur = sVar36;
      if ((alloc.talloc0)->allocBlockSize <
          (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0._0_8_ << 2)) {
        pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
      }
      else {
        v2.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
        pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v2);
        (alloc.talloc0)->ptr = pcVar41;
        sVar36 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar36;
        (alloc.talloc0)->end = v2.field_0.v[0];
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)v2.field_0.v[0] <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          v2.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
          pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v2);
          (alloc.talloc0)->ptr = pcVar41;
          sVar36 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar36;
          (alloc.talloc0)->end = v2.field_0.v[0];
          (alloc.talloc0)->cur =
               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0
               ._0_8_;
          if ((ulong)v2.field_0.v[0] <
              (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0._0_8_) {
            (alloc.talloc0)->cur = 0;
            pcVar41 = (char *)0x0;
            goto LAB_00c4195d;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar36;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar42;
      pcVar41 = (alloc.talloc0)->ptr +
                (uVar57 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                          lower.field_0._0_8_);
    }
LAB_00c4195d:
    pcVar41[0x60] = '\0';
    pcVar41[0x61] = '\0';
    pcVar41[0x62] = -0x80;
    pcVar41[99] = '\x7f';
    pcVar41[100] = '\0';
    pcVar41[0x65] = '\0';
    pcVar41[0x66] = -0x80;
    pcVar41[0x67] = '\x7f';
    pcVar41[0x68] = '\0';
    pcVar41[0x69] = '\0';
    pcVar41[0x6a] = -0x80;
    pcVar41[0x6b] = '\x7f';
    pcVar41[0x6c] = '\0';
    pcVar41[0x6d] = '\0';
    pcVar41[0x6e] = -0x80;
    pcVar41[0x6f] = '\x7f';
    pcVar41[0x40] = '\0';
    pcVar41[0x41] = '\0';
    pcVar41[0x42] = -0x80;
    pcVar41[0x43] = '\x7f';
    pcVar41[0x44] = '\0';
    pcVar41[0x45] = '\0';
    pcVar41[0x46] = -0x80;
    pcVar41[0x47] = '\x7f';
    pcVar41[0x48] = '\0';
    pcVar41[0x49] = '\0';
    pcVar41[0x4a] = -0x80;
    pcVar41[0x4b] = '\x7f';
    pcVar41[0x4c] = '\0';
    pcVar41[0x4d] = '\0';
    pcVar41[0x4e] = -0x80;
    pcVar41[0x4f] = '\x7f';
    pcVar41[0x20] = '\0';
    pcVar41[0x21] = '\0';
    pcVar41[0x22] = -0x80;
    pcVar41[0x23] = '\x7f';
    pcVar41[0x24] = '\0';
    pcVar41[0x25] = '\0';
    pcVar41[0x26] = -0x80;
    pcVar41[0x27] = '\x7f';
    pcVar41[0x28] = '\0';
    pcVar41[0x29] = '\0';
    pcVar41[0x2a] = -0x80;
    pcVar41[0x2b] = '\x7f';
    pcVar41[0x2c] = '\0';
    pcVar41[0x2d] = '\0';
    pcVar41[0x2e] = -0x80;
    pcVar41[0x2f] = '\x7f';
    pcVar41[0x70] = '\0';
    pcVar41[0x71] = '\0';
    pcVar41[0x72] = -0x80;
    pcVar41[0x73] = -1;
    pcVar41[0x74] = '\0';
    pcVar41[0x75] = '\0';
    pcVar41[0x76] = -0x80;
    pcVar41[0x77] = -1;
    pcVar41[0x78] = '\0';
    pcVar41[0x79] = '\0';
    pcVar41[0x7a] = -0x80;
    pcVar41[0x7b] = -1;
    pcVar41[0x7c] = '\0';
    pcVar41[0x7d] = '\0';
    pcVar41[0x7e] = -0x80;
    pcVar41[0x7f] = -1;
    pcVar41[0x50] = '\0';
    pcVar41[0x51] = '\0';
    pcVar41[0x52] = -0x80;
    pcVar41[0x53] = -1;
    pcVar41[0x54] = '\0';
    pcVar41[0x55] = '\0';
    pcVar41[0x56] = -0x80;
    pcVar41[0x57] = -1;
    pcVar41[0x58] = '\0';
    pcVar41[0x59] = '\0';
    pcVar41[0x5a] = -0x80;
    pcVar41[0x5b] = -1;
    pcVar41[0x5c] = '\0';
    pcVar41[0x5d] = '\0';
    pcVar41[0x5e] = -0x80;
    pcVar41[0x5f] = -1;
    pcVar41[0x30] = '\0';
    pcVar41[0x31] = '\0';
    pcVar41[0x32] = -0x80;
    pcVar41[0x33] = -1;
    pcVar41[0x34] = '\0';
    pcVar41[0x35] = '\0';
    pcVar41[0x36] = -0x80;
    pcVar41[0x37] = -1;
    pcVar41[0x38] = '\0';
    pcVar41[0x39] = '\0';
    pcVar41[0x3a] = -0x80;
    pcVar41[0x3b] = -1;
    pcVar41[0x3c] = '\0';
    pcVar41[0x3d] = '\0';
    pcVar41[0x3e] = -0x80;
    pcVar41[0x3f] = -1;
    pcVar41[0x80] = '\0';
    pcVar41[0x81] = '\0';
    pcVar41[0x82] = '\0';
    pcVar41[0x83] = '\0';
    pcVar41[0x84] = '\0';
    pcVar41[0x85] = '\0';
    pcVar41[0x86] = '\0';
    pcVar41[0x87] = '\0';
    pcVar41[0x88] = '\0';
    pcVar41[0x89] = '\0';
    pcVar41[0x8a] = '\0';
    pcVar41[0x8b] = '\0';
    pcVar41[0x8c] = '\0';
    pcVar41[0x8d] = '\0';
    pcVar41[0x8e] = '\0';
    pcVar41[0x8f] = '\0';
    pcVar41[0x90] = '\0';
    pcVar41[0x91] = '\0';
    pcVar41[0x92] = '\0';
    pcVar41[0x93] = '\0';
    pcVar41[0x94] = '\0';
    pcVar41[0x95] = '\0';
    pcVar41[0x96] = '\0';
    pcVar41[0x97] = '\0';
    pcVar41[0x98] = '\0';
    pcVar41[0x99] = '\0';
    pcVar41[0x9a] = '\0';
    pcVar41[0x9b] = '\0';
    pcVar41[0x9c] = '\0';
    pcVar41[0x9d] = '\0';
    pcVar41[0x9e] = '\0';
    pcVar41[0x9f] = '\0';
    pcVar41[0xa0] = '\0';
    pcVar41[0xa1] = '\0';
    pcVar41[0xa2] = '\0';
    pcVar41[0xa3] = '\0';
    pcVar41[0xa4] = '\0';
    pcVar41[0xa5] = '\0';
    pcVar41[0xa6] = '\0';
    pcVar41[0xa7] = '\0';
    pcVar41[0xa8] = '\0';
    pcVar41[0xa9] = '\0';
    pcVar41[0xaa] = '\0';
    pcVar41[0xab] = '\0';
    pcVar41[0xac] = '\0';
    pcVar41[0xad] = '\0';
    pcVar41[0xae] = '\0';
    pcVar41[0xaf] = '\0';
    pcVar41[0xb0] = '\0';
    pcVar41[0xb1] = '\0';
    pcVar41[0xb2] = '\0';
    pcVar41[0xb3] = '\0';
    pcVar41[0xb4] = '\0';
    pcVar41[0xb5] = '\0';
    pcVar41[0xb6] = '\0';
    pcVar41[0xb7] = '\0';
    pcVar41[0xb8] = '\0';
    pcVar41[0xb9] = '\0';
    pcVar41[0xba] = '\0';
    pcVar41[0xbb] = '\0';
    pcVar41[0xbc] = '\0';
    pcVar41[0xbd] = '\0';
    pcVar41[0xbe] = '\0';
    pcVar41[0xbf] = '\0';
    pcVar41[0xc0] = '\0';
    pcVar41[0xc1] = '\0';
    pcVar41[0xc2] = '\0';
    pcVar41[0xc3] = '\0';
    pcVar41[0xc4] = '\0';
    pcVar41[0xc5] = '\0';
    pcVar41[0xc6] = '\0';
    pcVar41[199] = '\0';
    pcVar41[200] = '\0';
    pcVar41[0xc9] = '\0';
    pcVar41[0xca] = '\0';
    pcVar41[0xcb] = '\0';
    pcVar41[0xcc] = '\0';
    pcVar41[0xcd] = '\0';
    pcVar41[0xce] = '\0';
    pcVar41[0xcf] = '\0';
    pcVar41[0xd0] = '\0';
    pcVar41[0xd1] = '\0';
    pcVar41[0xd2] = '\0';
    pcVar41[0xd3] = '\0';
    pcVar41[0xd4] = '\0';
    pcVar41[0xd5] = '\0';
    pcVar41[0xd6] = '\0';
    pcVar41[0xd7] = '\0';
    pcVar41[0xd8] = '\0';
    pcVar41[0xd9] = '\0';
    pcVar41[0xda] = '\0';
    pcVar41[0xdb] = '\0';
    pcVar41[0xdc] = '\0';
    pcVar41[0xdd] = '\0';
    pcVar41[0xde] = '\0';
    pcVar41[0xdf] = '\0';
    pcVar41[0] = '\b';
    pcVar41[1] = '\0';
    pcVar41[2] = '\0';
    pcVar41[3] = '\0';
    pcVar41[4] = '\0';
    pcVar41[5] = '\0';
    pcVar41[6] = '\0';
    pcVar41[7] = '\0';
    pcVar41[8] = '\b';
    pcVar41[9] = '\0';
    pcVar41[10] = '\0';
    pcVar41[0xb] = '\0';
    pcVar41[0xc] = '\0';
    pcVar41[0xd] = '\0';
    pcVar41[0xe] = '\0';
    pcVar41[0xf] = '\0';
    pcVar41[0x10] = '\b';
    pcVar41[0x11] = '\0';
    pcVar41[0x12] = '\0';
    pcVar41[0x13] = '\0';
    pcVar41[0x14] = '\0';
    pcVar41[0x15] = '\0';
    pcVar41[0x16] = '\0';
    pcVar41[0x17] = '\0';
    pcVar41[0x18] = '\b';
    pcVar41[0x19] = '\0';
    pcVar41[0x1a] = '\0';
    pcVar41[0x1b] = '\0';
    pcVar41[0x1c] = '\0';
    pcVar41[0x1d] = '\0';
    pcVar41[0x1e] = '\0';
    pcVar41[0x1f] = '\0';
    uVar57 = 1;
    uVar42 = 0;
    goto LAB_00c419c6;
  }
  right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
       0x100;
  pTVar9 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar9->alloc)._M_b._M_p) {
    geomID.field_0.v[1]._0_1_ = 1;
    geomID.field_0.v[0] = (longlong)pTVar9;
    MutexSys::lock(&pTVar9->mutex);
    if ((pTVar9->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar2 = &((pTVar9->alloc)._M_b._M_p)->bytesUsed;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (pTVar9->alloc1).bytesUsed + (pTVar9->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar2 = &((pTVar9->alloc)._M_b._M_p)->bytesFree;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar9->alloc0).end + (pTVar9->alloc1).end) -
           ((pTVar9->alloc0).cur + (pTVar9->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar2 = &((pTVar9->alloc)._M_b._M_p)->bytesWasted;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (pTVar9->alloc1).bytesWasted + (pTVar9->alloc0).bytesWasted;
      UNLOCK();
    }
    (pTVar9->alloc0).bytesUsed = 0;
    (pTVar9->alloc0).bytesWasted = 0;
    (pTVar9->alloc0).end = 0;
    (pTVar9->alloc0).allocBlockSize = 0;
    (pTVar9->alloc0).ptr = (char *)0x0;
    (pTVar9->alloc0).cur = 0;
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar9->alloc1).bytesUsed = 0;
      (pTVar9->alloc1).bytesWasted = 0;
      (pTVar9->alloc1).end = 0;
      (pTVar9->alloc1).allocBlockSize = 0;
      (pTVar9->alloc1).ptr = (char *)0x0;
      (pTVar9->alloc1).cur = 0;
    }
    else {
      (pTVar9->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar9->alloc1).ptr = (char *)0x0;
      (pTVar9->alloc1).cur = 0;
      (pTVar9->alloc1).end = 0;
      (pTVar9->alloc1).allocBlockSize = 0;
      (pTVar9->alloc1).bytesUsed = 0;
      (pTVar9->alloc1).bytesWasted = 0;
      (pTVar9->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar9->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    v2.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
    v2.field_0.v[1]._0_1_ = 1;
    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         pTVar9;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    iVar10._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,iVar10,(ThreadLocal2 **)&left);
    }
    else {
      *iVar10._M_current =
           (ThreadLocal2 *)
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      pppTVar3 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar3 = *pppTVar3 + 1;
    }
    uVar46 = &FastAllocator::s_thread_local_allocators_lock;
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if (geomID.field_0.v[1]._0_1_ == '\x01') {
      uVar46 = geomID.field_0.v[0];
      MutexSys::unlock((MutexSys *)geomID.field_0.v[0]);
    }
  }
  (alloc.talloc0)->bytesUsed =
       (alloc.talloc0)->bytesUsed +
       right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
  sVar36 = (alloc.talloc0)->cur;
  uVar42 = (ulong)(-(int)sVar36 & 0xf);
  uVar57 = sVar36 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0._0_8_ + uVar42;
  (alloc.talloc0)->cur = uVar57;
  if ((alloc.talloc0)->end < uVar57) {
    (alloc.talloc0)->cur = sVar36;
    uVar46 = alloc.alloc;
    if ((alloc.talloc0)->allocBlockSize <
        (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                field_0._0_8_ << 2)) {
      pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
    }
    else {
      v2.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
      pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v2);
      (alloc.talloc0)->ptr = pcVar41;
      sVar36 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar36;
      (alloc.talloc0)->end = v2.field_0.v[0];
      (alloc.talloc0)->cur =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      if ((ulong)v2.field_0.v[0] <
          (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                 field_0._0_8_) {
        (alloc.talloc0)->cur = 0;
        v2.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
        uVar46 = alloc.alloc;
        pcVar41 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v2);
        (alloc.talloc0)->ptr = pcVar41;
        sVar36 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar36;
        (alloc.talloc0)->end = v2.field_0.v[0];
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)v2.field_0.v[0] <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          pcVar41 = (char *)0x0;
          goto LAB_00c41864;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar36;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar42;
    pcVar41 = (alloc.talloc0)->ptr +
              (uVar57 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                        lower.field_0._0_8_);
  }
LAB_00c41864:
  pcVar41[0xe0] = '\0';
  pcVar41[0xe1] = '\0';
  pcVar41[0xe2] = -0x80;
  pcVar41[0xe3] = '\x7f';
  pcVar41[0xe4] = '\0';
  pcVar41[0xe5] = '\0';
  pcVar41[0xe6] = -0x80;
  pcVar41[0xe7] = '\x7f';
  pcVar41[0xe8] = '\0';
  pcVar41[0xe9] = '\0';
  pcVar41[0xea] = -0x80;
  pcVar41[0xeb] = '\x7f';
  pcVar41[0xec] = '\0';
  pcVar41[0xed] = '\0';
  pcVar41[0xee] = -0x80;
  pcVar41[0xef] = '\x7f';
  pcVar41[0xf0] = '\0';
  pcVar41[0xf1] = '\0';
  pcVar41[0xf2] = -0x80;
  pcVar41[0xf3] = -1;
  pcVar41[0xf4] = '\0';
  pcVar41[0xf5] = '\0';
  pcVar41[0xf6] = -0x80;
  pcVar41[0xf7] = -1;
  pcVar41[0xf8] = '\0';
  pcVar41[0xf9] = '\0';
  pcVar41[0xfa] = -0x80;
  pcVar41[0xfb] = -1;
  pcVar41[0xfc] = '\0';
  pcVar41[0xfd] = '\0';
  pcVar41[0xfe] = -0x80;
  pcVar41[0xff] = -1;
  pcVar41[0x60] = '\0';
  pcVar41[0x61] = '\0';
  pcVar41[0x62] = -0x80;
  pcVar41[99] = '\x7f';
  pcVar41[100] = '\0';
  pcVar41[0x65] = '\0';
  pcVar41[0x66] = -0x80;
  pcVar41[0x67] = '\x7f';
  pcVar41[0x68] = '\0';
  pcVar41[0x69] = '\0';
  pcVar41[0x6a] = -0x80;
  pcVar41[0x6b] = '\x7f';
  pcVar41[0x6c] = '\0';
  pcVar41[0x6d] = '\0';
  pcVar41[0x6e] = -0x80;
  pcVar41[0x6f] = '\x7f';
  pcVar41[0x40] = '\0';
  pcVar41[0x41] = '\0';
  pcVar41[0x42] = -0x80;
  pcVar41[0x43] = '\x7f';
  pcVar41[0x44] = '\0';
  pcVar41[0x45] = '\0';
  pcVar41[0x46] = -0x80;
  pcVar41[0x47] = '\x7f';
  pcVar41[0x48] = '\0';
  pcVar41[0x49] = '\0';
  pcVar41[0x4a] = -0x80;
  pcVar41[0x4b] = '\x7f';
  pcVar41[0x4c] = '\0';
  pcVar41[0x4d] = '\0';
  pcVar41[0x4e] = -0x80;
  pcVar41[0x4f] = '\x7f';
  pcVar41[0x20] = '\0';
  pcVar41[0x21] = '\0';
  pcVar41[0x22] = -0x80;
  pcVar41[0x23] = '\x7f';
  pcVar41[0x24] = '\0';
  pcVar41[0x25] = '\0';
  pcVar41[0x26] = -0x80;
  pcVar41[0x27] = '\x7f';
  pcVar41[0x28] = '\0';
  pcVar41[0x29] = '\0';
  pcVar41[0x2a] = -0x80;
  pcVar41[0x2b] = '\x7f';
  pcVar41[0x2c] = '\0';
  pcVar41[0x2d] = '\0';
  pcVar41[0x2e] = -0x80;
  pcVar41[0x2f] = '\x7f';
  pcVar41[0x70] = '\0';
  pcVar41[0x71] = '\0';
  pcVar41[0x72] = -0x80;
  pcVar41[0x73] = -1;
  pcVar41[0x74] = '\0';
  pcVar41[0x75] = '\0';
  pcVar41[0x76] = -0x80;
  pcVar41[0x77] = -1;
  pcVar41[0x78] = '\0';
  pcVar41[0x79] = '\0';
  pcVar41[0x7a] = -0x80;
  pcVar41[0x7b] = -1;
  pcVar41[0x7c] = '\0';
  pcVar41[0x7d] = '\0';
  pcVar41[0x7e] = -0x80;
  pcVar41[0x7f] = -1;
  pcVar41[0x50] = '\0';
  pcVar41[0x51] = '\0';
  pcVar41[0x52] = -0x80;
  pcVar41[0x53] = -1;
  pcVar41[0x54] = '\0';
  pcVar41[0x55] = '\0';
  pcVar41[0x56] = -0x80;
  pcVar41[0x57] = -1;
  pcVar41[0x58] = '\0';
  pcVar41[0x59] = '\0';
  pcVar41[0x5a] = -0x80;
  pcVar41[0x5b] = -1;
  pcVar41[0x5c] = '\0';
  pcVar41[0x5d] = '\0';
  pcVar41[0x5e] = -0x80;
  pcVar41[0x5f] = -1;
  pcVar41[0x30] = '\0';
  pcVar41[0x31] = '\0';
  pcVar41[0x32] = -0x80;
  pcVar41[0x33] = -1;
  pcVar41[0x34] = '\0';
  pcVar41[0x35] = '\0';
  pcVar41[0x36] = -0x80;
  pcVar41[0x37] = -1;
  pcVar41[0x38] = '\0';
  pcVar41[0x39] = '\0';
  pcVar41[0x3a] = -0x80;
  pcVar41[0x3b] = -1;
  pcVar41[0x3c] = '\0';
  pcVar41[0x3d] = '\0';
  pcVar41[0x3e] = -0x80;
  pcVar41[0x3f] = -1;
  pcVar41[0x80] = '\0';
  pcVar41[0x81] = '\0';
  pcVar41[0x82] = '\0';
  pcVar41[0x83] = '\0';
  pcVar41[0x84] = '\0';
  pcVar41[0x85] = '\0';
  pcVar41[0x86] = '\0';
  pcVar41[0x87] = '\0';
  pcVar41[0x88] = '\0';
  pcVar41[0x89] = '\0';
  pcVar41[0x8a] = '\0';
  pcVar41[0x8b] = '\0';
  pcVar41[0x8c] = '\0';
  pcVar41[0x8d] = '\0';
  pcVar41[0x8e] = '\0';
  pcVar41[0x8f] = '\0';
  pcVar41[0x90] = '\0';
  pcVar41[0x91] = '\0';
  pcVar41[0x92] = '\0';
  pcVar41[0x93] = '\0';
  pcVar41[0x94] = '\0';
  pcVar41[0x95] = '\0';
  pcVar41[0x96] = '\0';
  pcVar41[0x97] = '\0';
  pcVar41[0x98] = '\0';
  pcVar41[0x99] = '\0';
  pcVar41[0x9a] = '\0';
  pcVar41[0x9b] = '\0';
  pcVar41[0x9c] = '\0';
  pcVar41[0x9d] = '\0';
  pcVar41[0x9e] = '\0';
  pcVar41[0x9f] = '\0';
  pcVar41[0xa0] = '\0';
  pcVar41[0xa1] = '\0';
  pcVar41[0xa2] = '\0';
  pcVar41[0xa3] = '\0';
  pcVar41[0xa4] = '\0';
  pcVar41[0xa5] = '\0';
  pcVar41[0xa6] = '\0';
  pcVar41[0xa7] = '\0';
  pcVar41[0xa8] = '\0';
  pcVar41[0xa9] = '\0';
  pcVar41[0xaa] = '\0';
  pcVar41[0xab] = '\0';
  pcVar41[0xac] = '\0';
  pcVar41[0xad] = '\0';
  pcVar41[0xae] = '\0';
  pcVar41[0xaf] = '\0';
  pcVar41[0xb0] = '\0';
  pcVar41[0xb1] = '\0';
  pcVar41[0xb2] = '\0';
  pcVar41[0xb3] = '\0';
  pcVar41[0xb4] = '\0';
  pcVar41[0xb5] = '\0';
  pcVar41[0xb6] = '\0';
  pcVar41[0xb7] = '\0';
  pcVar41[0xb8] = '\0';
  pcVar41[0xb9] = '\0';
  pcVar41[0xba] = '\0';
  pcVar41[0xbb] = '\0';
  pcVar41[0xbc] = '\0';
  pcVar41[0xbd] = '\0';
  pcVar41[0xbe] = '\0';
  pcVar41[0xbf] = '\0';
  pcVar41[0xc0] = '\0';
  pcVar41[0xc1] = '\0';
  pcVar41[0xc2] = '\0';
  pcVar41[0xc3] = '\0';
  pcVar41[0xc4] = '\0';
  pcVar41[0xc5] = '\0';
  pcVar41[0xc6] = '\0';
  pcVar41[199] = '\0';
  pcVar41[200] = '\0';
  pcVar41[0xc9] = '\0';
  pcVar41[0xca] = '\0';
  pcVar41[0xcb] = '\0';
  pcVar41[0xcc] = '\0';
  pcVar41[0xcd] = '\0';
  pcVar41[0xce] = '\0';
  pcVar41[0xcf] = '\0';
  pcVar41[0xd0] = '\0';
  pcVar41[0xd1] = '\0';
  pcVar41[0xd2] = '\0';
  pcVar41[0xd3] = '\0';
  pcVar41[0xd4] = '\0';
  pcVar41[0xd5] = '\0';
  pcVar41[0xd6] = '\0';
  pcVar41[0xd7] = '\0';
  pcVar41[0xd8] = '\0';
  pcVar41[0xd9] = '\0';
  pcVar41[0xda] = '\0';
  pcVar41[0xdb] = '\0';
  pcVar41[0xdc] = '\0';
  pcVar41[0xdd] = '\0';
  pcVar41[0xde] = '\0';
  pcVar41[0xdf] = '\0';
  pcVar41[0] = '\b';
  pcVar41[1] = '\0';
  pcVar41[2] = '\0';
  pcVar41[3] = '\0';
  pcVar41[4] = '\0';
  pcVar41[5] = '\0';
  pcVar41[6] = '\0';
  pcVar41[7] = '\0';
  pcVar41[8] = '\b';
  pcVar41[9] = '\0';
  pcVar41[10] = '\0';
  pcVar41[0xb] = '\0';
  pcVar41[0xc] = '\0';
  pcVar41[0xd] = '\0';
  pcVar41[0xe] = '\0';
  pcVar41[0xf] = '\0';
  pcVar41[0x10] = '\b';
  pcVar41[0x11] = '\0';
  pcVar41[0x12] = '\0';
  pcVar41[0x13] = '\0';
  pcVar41[0x14] = '\0';
  pcVar41[0x15] = '\0';
  pcVar41[0x16] = '\0';
  pcVar41[0x17] = '\0';
  pcVar41[0x18] = '\b';
  pcVar41[0x19] = '\0';
  pcVar41[0x1a] = '\0';
  pcVar41[0x1b] = '\0';
  pcVar41[0x1c] = '\0';
  pcVar41[0x1d] = '\0';
  pcVar41[0x1e] = '\0';
  pcVar41[0x1f] = '\0';
  uVar42 = CONCAT71((int7)((ulong)uVar46 >> 8),1);
  uVar57 = 6;
LAB_00c419c6:
  local_1e80._16_8_ = 0xff800000ff800000;
  local_1e80._8_8_ = 0xff800000ff800000;
  sVar61 = 0x7f8000007f800000;
  uVar46 = 0x7f8000007f800000;
  if (local_848 != (Device *)0x0) {
    local_1e28._0_4_ = (int)uVar42;
    pBVar55 = &values[0].dt;
    pDVar58 = (Device *)0x0;
    local_1dd8._8_8_ = 0x7f8000007f800000;
    local_1dd8._0_8_ = 0x7f8000007f800000;
    aStack_1e60._M_allocated_capacity = 0x7f8000007f800000;
    local_1e80._24_8_ = 0x7f8000007f800000;
    local_1e38._8_8_ = 0xff800000ff800000;
    local_1e38._0_8_ = 0xff800000ff800000;
    local_1e80._16_8_ = 0xff800000ff800000;
    local_1e80._8_8_ = 0xff800000ff800000;
    do {
      createLargeLeaf((NodeRecordMB4D *)&v2,this,in_00,alloc);
      auVar88 = _DAT_01f80810;
      auVar73 = _DAT_01f80800;
      pBVar55[-10].lower = (float)v2.field_0.v[0]._0_4_;
      pBVar55[-10].upper = (float)v2.field_0._4_4_;
      auVar80._8_8_ = local_1c68._8_8_;
      auVar80._0_8_ = local_1c68._0_8_;
      *(undefined1 (*) [16])(pBVar55 + -8) = auVar80;
      auVar83._8_8_ = local_1c58._8_8_;
      auVar83._0_8_ = local_1c58._M_allocated_capacity;
      *(undefined1 (*) [16])(pBVar55 + -6) = auVar83;
      auVar86._8_8_ = local_1c48._8_8_;
      auVar86._0_8_ = local_1c48._0_8_;
      *(undefined1 (*) [16])(pBVar55 + -4) = auVar86;
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pBVar55 + -2))->_M_local_buf = local_1c38;
      pBVar55->lower = (float)local_1c28._0_4_;
      pBVar55->upper = (float)local_1c28._4_4_;
      local_1dd8.v = (__m128)minps(local_1dd8.v,auVar80);
      local_1e38 = maxps(local_1e38,auVar83);
      register0x00001200 = minps(stack0xffffffffffffe198,auVar86);
      local_1e80._8_16_ = maxps(local_1e80._8_16_,(undefined1  [16])local_1c38);
      pDVar58 = (Device *)
                ((long)&(((LBBox<embree::Vec3fa> *)&(pDVar58->super_State).super_RefCount)->bounds0)
                        .lower.field_0 + 1);
      pBVar55 = pBVar55 + 0xc;
      in_00 = (BuildRecord *)
              &in_00[1].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds1.upper;
    } while (pDVar58 < local_848);
    if (((uint)uVar57 | (uint)pcVar41 & 0xf) == 1) {
      if (local_848 != (Device *)0x0) {
        uVar42 = (ulong)pcVar41 & 0xfffffffffffffff0;
        pfVar37 = &values[0].dt.upper;
        pDVar58 = (Device *)0x0;
        do {
          *(undefined8 *)(uVar42 + (long)pDVar58 * 8) = *(undefined8 *)(pfVar37 + -0x15);
          fVar90 = ((BBox1f *)(pfVar37 + -1))->lower;
          fVar89 = 1.0 / (*pfVar37 - fVar90);
          fVar95 = -fVar90 * fVar89;
          fVar84 = 1.0 - fVar95;
          auVar82._0_4_ = pfVar37[-0x11] * fVar84 + pfVar37[-9] * fVar95;
          auVar82._4_4_ = pfVar37[-0x10] * fVar84 + pfVar37[-8] * fVar95;
          auVar82._8_4_ = pfVar37[-0xf] * fVar84 + pfVar37[-7] * fVar95;
          auVar82._12_4_ = pfVar37[-0xe] * fVar84 + pfVar37[-6] * fVar95;
          auVar85._0_4_ = fVar84 * pfVar37[-0xd] + fVar95 * pfVar37[-5];
          auVar85._4_4_ = fVar84 * pfVar37[-0xc] + fVar95 * pfVar37[-4];
          auVar85._8_4_ = fVar84 * pfVar37[-0xb] + fVar95 * pfVar37[-3];
          auVar85._12_4_ = fVar84 * pfVar37[-10] + fVar95 * pfVar37[-2];
          fVar89 = (1.0 - fVar90) * fVar89;
          fVar90 = 1.0 - fVar89;
          auVar79._0_4_ = pfVar37[-0x11] * fVar90 + pfVar37[-9] * fVar89;
          auVar79._4_4_ = pfVar37[-0x10] * fVar90 + pfVar37[-8] * fVar89;
          auVar79._8_4_ = pfVar37[-0xf] * fVar90 + pfVar37[-7] * fVar89;
          auVar79._12_4_ = pfVar37[-0xe] * fVar90 + pfVar37[-6] * fVar89;
          auVar91._0_4_ = fVar90 * pfVar37[-0xd] + fVar89 * pfVar37[-5];
          auVar91._4_4_ = fVar90 * pfVar37[-0xc] + fVar89 * pfVar37[-4];
          auVar91._8_4_ = fVar90 * pfVar37[-0xb] + fVar89 * pfVar37[-3];
          auVar91._12_4_ = fVar90 * pfVar37[-10] + fVar89 * pfVar37[-2];
          auVar83 = minps(auVar82,auVar88);
          auVar86 = maxps(auVar85,auVar73);
          auVar80 = minps(auVar79,auVar88);
          auVar92 = maxps(auVar91,auVar73);
          fVar90 = auVar83._0_4_ - ABS(auVar83._0_4_) * 4.7683716e-07;
          fVar84 = auVar83._4_4_ - ABS(auVar83._4_4_) * 4.7683716e-07;
          fVar89 = auVar83._8_4_ - ABS(auVar83._8_4_) * 4.7683716e-07;
          fVar95 = ABS(auVar86._0_4_) * 4.7683716e-07 + auVar86._0_4_;
          fVar93 = ABS(auVar86._4_4_) * 4.7683716e-07 + auVar86._4_4_;
          fVar94 = ABS(auVar86._8_4_) * 4.7683716e-07 + auVar86._8_4_;
          *(float *)(uVar42 + 0x20 + (long)pDVar58 * 4) = fVar90;
          *(float *)(uVar42 + 0x40 + (long)pDVar58 * 4) = fVar84;
          *(float *)(uVar42 + 0x60 + (long)pDVar58 * 4) = fVar89;
          *(float *)(uVar42 + 0x30 + (long)pDVar58 * 4) = fVar95;
          *(float *)(uVar42 + 0x50 + (long)pDVar58 * 4) = fVar93;
          *(float *)(uVar42 + 0x70 + (long)pDVar58 * 4) = fVar94;
          *(float *)(uVar42 + 0x80 + (long)pDVar58 * 4) =
               (auVar80._0_4_ - ABS(auVar80._0_4_) * 4.7683716e-07) - fVar90;
          *(float *)(uVar42 + 0xa0 + (long)pDVar58 * 4) =
               (auVar80._4_4_ - ABS(auVar80._4_4_) * 4.7683716e-07) - fVar84;
          *(float *)(uVar42 + 0xc0 + (long)pDVar58 * 4) =
               (auVar80._8_4_ - ABS(auVar80._8_4_) * 4.7683716e-07) - fVar89;
          *(float *)(uVar42 + 0x90 + (long)pDVar58 * 4) =
               (ABS(auVar92._0_4_) * 4.7683716e-07 + auVar92._0_4_) - fVar95;
          *(float *)(uVar42 + 0xb0 + (long)pDVar58 * 4) =
               (ABS(auVar92._4_4_) * 4.7683716e-07 + auVar92._4_4_) - fVar93;
          *(float *)(uVar42 + 0xd0 + (long)pDVar58 * 4) =
               (ABS(auVar92._8_4_) * 4.7683716e-07 + auVar92._8_4_) - fVar94;
          pDVar58 = (Device *)
                    ((long)(((LBBox<embree::Vec3fa> *)&(pDVar58->super_State).super_RefCount)->
                           bounds0).lower.field_0.m128 + 1);
          pfVar37 = pfVar37 + 0x18;
        } while (local_848 != pDVar58);
      }
    }
    else if (local_848 != (Device *)0x0) {
      uVar42 = (ulong)pcVar41 & 0xfffffffffffffff0;
      pfVar37 = &values[0].dt.upper;
      pDVar58 = (Device *)0x0;
      do {
        *(undefined8 *)(uVar42 + (long)pDVar58 * 8) = *(undefined8 *)(pfVar37 + -0x15);
        fVar90 = *pfVar37;
        fVar84 = ((BBox1f *)(pfVar37 + -1))->lower;
        fVar95 = 1.0 / (fVar90 - fVar84);
        fVar93 = -fVar84 * fVar95;
        fVar89 = 1.0 - fVar93;
        auVar71._0_4_ = pfVar37[-0x11] * fVar89 + pfVar37[-9] * fVar93;
        auVar71._4_4_ = pfVar37[-0x10] * fVar89 + pfVar37[-8] * fVar93;
        auVar71._8_4_ = pfVar37[-0xf] * fVar89 + pfVar37[-7] * fVar93;
        auVar71._12_4_ = pfVar37[-0xe] * fVar89 + pfVar37[-6] * fVar93;
        auVar98._0_4_ = fVar89 * pfVar37[-0xd] + fVar93 * pfVar37[-5];
        auVar98._4_4_ = fVar89 * pfVar37[-0xc] + fVar93 * pfVar37[-4];
        auVar98._8_4_ = fVar89 * pfVar37[-0xb] + fVar93 * pfVar37[-3];
        auVar98._12_4_ = fVar89 * pfVar37[-10] + fVar93 * pfVar37[-2];
        fVar95 = (1.0 - fVar84) * fVar95;
        fVar89 = 1.0 - fVar95;
        auVar92._0_4_ = pfVar37[-0x11] * fVar89 + pfVar37[-9] * fVar95;
        auVar92._4_4_ = pfVar37[-0x10] * fVar89 + pfVar37[-8] * fVar95;
        auVar92._8_4_ = pfVar37[-0xf] * fVar89 + pfVar37[-7] * fVar95;
        auVar92._12_4_ = pfVar37[-0xe] * fVar89 + pfVar37[-6] * fVar95;
        auVar99._0_4_ = fVar89 * pfVar37[-0xd] + fVar95 * pfVar37[-5];
        auVar99._4_4_ = fVar89 * pfVar37[-0xc] + fVar95 * pfVar37[-4];
        auVar99._8_4_ = fVar89 * pfVar37[-0xb] + fVar95 * pfVar37[-3];
        auVar99._12_4_ = fVar89 * pfVar37[-10] + fVar95 * pfVar37[-2];
        auVar80 = minps(auVar71,_DAT_01f80810);
        auVar83 = maxps(auVar98,auVar73);
        auVar88 = minps(auVar92,_DAT_01f80810);
        auVar86 = maxps(auVar99,auVar73);
        fVar94 = auVar80._0_4_ - ABS(auVar80._0_4_) * 4.7683716e-07;
        fVar96 = auVar80._4_4_ - ABS(auVar80._4_4_) * 4.7683716e-07;
        fVar97 = auVar80._8_4_ - ABS(auVar80._8_4_) * 4.7683716e-07;
        fVar89 = ABS(auVar83._0_4_) * 4.7683716e-07 + auVar83._0_4_;
        fVar95 = ABS(auVar83._4_4_) * 4.7683716e-07 + auVar83._4_4_;
        fVar93 = ABS(auVar83._8_4_) * 4.7683716e-07 + auVar83._8_4_;
        *(float *)(uVar42 + 0x20 + (long)pDVar58 * 4) = fVar94;
        *(float *)(uVar42 + 0x40 + (long)pDVar58 * 4) = fVar96;
        *(float *)(uVar42 + 0x60 + (long)pDVar58 * 4) = fVar97;
        *(float *)(uVar42 + 0x30 + (long)pDVar58 * 4) = fVar89;
        *(float *)(uVar42 + 0x50 + (long)pDVar58 * 4) = fVar95;
        *(float *)(uVar42 + 0x70 + (long)pDVar58 * 4) = fVar93;
        *(float *)(uVar42 + 0x80 + (long)pDVar58 * 4) =
             (auVar88._0_4_ - ABS(auVar88._0_4_) * 4.7683716e-07) - fVar94;
        *(float *)(uVar42 + 0xa0 + (long)pDVar58 * 4) =
             (auVar88._4_4_ - ABS(auVar88._4_4_) * 4.7683716e-07) - fVar96;
        *(float *)(uVar42 + 0xc0 + (long)pDVar58 * 4) =
             (auVar88._8_4_ - ABS(auVar88._8_4_) * 4.7683716e-07) - fVar97;
        *(float *)(uVar42 + 0x90 + (long)pDVar58 * 4) =
             (ABS(auVar86._0_4_) * 4.7683716e-07 + auVar86._0_4_) - fVar89;
        *(float *)(uVar42 + 0xb0 + (long)pDVar58 * 4) =
             (ABS(auVar86._4_4_) * 4.7683716e-07 + auVar86._4_4_) - fVar95;
        *(float *)(uVar42 + 0xd0 + (long)pDVar58 * 4) =
             (ABS(auVar86._8_4_) * 4.7683716e-07 + auVar86._8_4_) - fVar93;
        *(float *)(uVar42 + 0xe0 + (long)pDVar58 * 4) = fVar84;
        *(uint *)(uVar42 + 0xf0 + (long)pDVar58 * 4) =
             ~-(uint)(fVar90 == 1.0) & (uint)fVar90 | -(uint)(fVar90 == 1.0) & 0x3f800001;
        pDVar58 = (Device *)
                  ((long)(((LBBox<embree::Vec3fa> *)&(pDVar58->super_State).super_RefCount)->bounds0
                         ).lower.field_0.m128 + 1);
        pfVar37 = pfVar37 + 0x18;
      } while (local_848 != pDVar58);
    }
    uVar42 = (ulong)(uint)local_1e28._0_4_;
    sVar61 = local_1e80._24_8_;
    uVar46 = aStack_1e60._M_allocated_capacity;
  }
  uVar24 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
  uVar23 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
  if ((char)uVar42 == '\0') {
    *(ulong *)local_1e10._M_p = uVar57 | (ulong)pcVar41;
    *(undefined8 *)&(((LBBox3fa *)(local_1e10._M_p + 0x10))->bounds0).lower.field_0 =
         local_1dd8._0_8_;
    *(undefined8 *)(local_1e10._M_p + 0x18) = local_1dd8._8_8_;
    *(undefined8 *)&((Vec3fa *)(local_1e10._M_p + 0x20))->field_0 = local_1e38._0_8_;
    *(undefined8 *)(local_1e10._M_p + 0x28) = local_1e38._8_8_;
    *(size_type *)&(((BBox<embree::Vec3fa> *)(local_1e10._M_p + 0x30))->lower).field_0 = sVar61;
    *(undefined8 *)(local_1e10._M_p + 0x38) = uVar46;
    uVar46 = local_1e80._8_8_;
    uVar35 = local_1e80._16_8_;
  }
  else {
    vSplitPos.field_0.v[1] = (longlong)&this->recalculatePrimRef;
    vSplitPos.field_0.v[0] = (longlong)&current.super_BuildRecord.prims;
    geomID.field_0.v[0] = 0x7f8000007f800000;
    geomID.field_0.v[1] = 0x7f8000007f800000;
    local_1b38._0_8_ = 0xff800000ff800000;
    local_1b38._8_8_ = 0xff800000ff800000;
    local_1b28._0_8_ = (pointer)0x7f8000007f800000;
    local_1b28._8_8_ = 0x7f8000007f800000;
    local_1b18._M_allocated_capacity = 0xff800000ff800000;
    local_1b18._8_8_ = 0xff800000ff800000;
    if (current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end -
        current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin < 0xc00) {
      v2.field_0.v[0] = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
      v2.field_0.v[1] = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)&left,(anon_class_16_2_aeee9775 *)&vSplitPos,
                 (range<unsigned_long> *)&v2);
    }
    else {
      v2.field_0.v[1]._4_2_ = 0x401;
      local_1c58._M_allocated_capacity = 0;
      local_1c58._8_8_ = 0;
      local_1c38._M_allocated_capacity = 8;
      tbb::detail::r1::initialize((task_group_context *)&v2);
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           uVar24;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           uVar23;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0x400;
      isLeft.split = (Split *)&vSplitMask;
      isLeft.vSplitPos = &vSplitPos;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::TriangleMesh>>(embree::sse2::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::TriangleMesh>>(embree::sse2::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::TriangleMesh>>(embree::sse2::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::TriangleMesh>>(embree::sse2::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::TriangleMesh>>(embree::sse2::RecalculatePrimRef<embree::TriangleMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&left,(d1 *)&right,(blocked_range<unsigned_long> *)&geomID
                 ,(LBBox<embree::Vec3fa> *)&isLeft,
                 (anon_class_16_2_ed117de8_conflict31 *)isLeft.split,(anon_class_1_0_00000001 *)&v2,
                 (task_group_context *)this);
      cVar27 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&v2);
      if (cVar27 != '\0') {
        prVar33 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar33,"task cancelled");
        __cxa_throw(prVar33,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&v2);
    }
    *(ulong *)local_1e10._M_p = uVar57 | (ulong)pcVar41;
    *(undefined8 *)&(((LBBox3fa *)(local_1e10._M_p + 0x10))->bounds0).lower.field_0 =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
    *(undefined8 *)(local_1e10._M_p + 0x18) =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_;
    *(undefined8 *)&((Vec3fa *)(local_1e10._M_p + 0x20))->field_0 =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_;
    *(undefined8 *)(local_1e10._M_p + 0x28) =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._8_8_;
    *(undefined8 *)&(((BBox<embree::Vec3fa> *)(local_1e10._M_p + 0x30))->lower).field_0 =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_;
    *(undefined8 *)(local_1e10._M_p + 0x38) =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_;
    uVar46 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             _0_8_;
    uVar35 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             _8_8_;
  }
  *(undefined8 *)&((Vec3fa *)(local_1e10._M_p + 0x40))->field_0 = uVar46;
  *(undefined8 *)(local_1e10._M_p + 0x48) = uVar35;
  *(BBox1f *)(local_1e10._M_p + 0x50) = current.super_BuildRecord.prims.super_PrimInfoMB.time_range;
  if (local_848 == (Device *)0x0) {
    return (NodeRecordMB4D *)local_1e10._M_p;
  }
  pDVar58 = (Device *)0x0;
  do {
    pFVar8 = local_8c8[(long)pDVar58];
    psVar1 = &pFVar8->slotMask;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      pDVar7 = pFVar8->device;
      if (pDVar7 != (Device *)0x0) {
        sVar61 = (pDVar7->super_State).tri_accel._M_string_length;
        pvVar31 = (void *)(pDVar7->super_State).tri_accel.field_2._M_allocated_capacity;
        if (pvVar31 != (void *)0x0) {
          if (sVar61 * 0x50 < 0x1c00000) {
            alignedFree(pvVar31);
          }
          else {
            os_free(pvVar31,sVar61 * 0x50,
                    SUB81((pDVar7->super_State).super_RefCount.refCounter.
                          super___atomic_base<unsigned_long>._M_i,0));
          }
        }
        if (sVar61 != 0) {
          pp_Var11 = (pDVar7->super_State).super_RefCount._vptr_RefCount;
          (**(code **)*pp_Var11)(pp_Var11,sVar61 * -0x50,1);
        }
        (pDVar7->super_State).tri_accel._M_dataplus._M_p = (pointer)0x0;
        (pDVar7->super_State).tri_accel._M_string_length = 0;
        (pDVar7->super_State).tri_accel.field_2._M_allocated_capacity = 0;
      }
      operator_delete(pDVar7);
    }
    pDVar58 = (Device *)
              ((long)&(((LBBox<embree::Vec3fa> *)&(pDVar58->super_State).super_RefCount)->bounds0).
                      lower.field_0 + 1);
  } while (pDVar58 < local_848);
  return (NodeRecordMB4D *)local_1e10._M_p;
}

Assistant:

const NodeRecordMB4D createLargeLeaf(const BuildRecord& in, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (in.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* replace already found split by fallback split */
            const BuildRecordSplit current(BuildRecord(in.prims,in.depth),findFallback(in.prims));

            /* special case when directly creating leaf without any splits that could shrink time_range */
            bool force_split = false;
            if (current.depth == 1 && current.size() > 0)
            {
              BBox1f c = empty;
              BBox1f p = current.prims.time_range;
              for (size_t i=current.prims.begin(); i<current.prims.end(); i++) {
                mvector<PrimRefMB>& prims = *current.prims.prims;
                c.extend(prims[i].time_range);
              }
              
              force_split = c.lower > p.lower || c.upper < p.upper;
            }
	    
            /* create leaf for few primitives */
            if (current.size() <= cfg.maxLeafSize && current.split.data < Split::SPLIT_ENFORCE && !force_split)
              return createLeaf(current,alloc);
	  
            /* fill all children by always splitting the largest one */
            bool hasTimeSplits = false;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildListSplit children(current);

            do {
              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<children.size(); i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].size() <= cfg.maxLeafSize && children[i].split.data < Split::SPLIT_ENFORCE && !force_split)
                  continue;

                force_split = false;
                
                /* remember child with largest size */
                if (children[i].size() > bestSize) {
                  bestSize = children[i].size();
                  bestChild = i;
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecordSplit& brecord = children[bestChild];
              BuildRecordSplit lrecord(current.depth+1);
              BuildRecordSplit rrecord(current.depth+1);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(brecord.split,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;

              /* find new splits */
              lrecord.split = findFallback(lrecord.prims);
              rrecord.split = findFallback(rrecord.prims);
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));

            } while (children.size() < cfg.branchingFactor);

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = in.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* create node */
            auto node = createNode(children.children.data(),children.numChildren,alloc,hasTimeSplits);

            /* recurse into each child and perform reduction */
            LBBox3fa gbounds = empty;
            for (size_t i=0; i<children.size(); i++) {
              values[i] = createLargeLeaf(children[i],alloc);
              gbounds.extend(values[i].lbounds);
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (hasTimeSplits)
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }